

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_fma::forward
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int *piVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [32];
  undefined4 uVar19;
  undefined1 (*pauVar20) [32];
  bool bVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined4 *puVar25;
  undefined1 (*pauVar26) [32];
  long lVar27;
  Layer *pLVar28;
  uint uVar29;
  size_t sVar30;
  Option *opt_00;
  long lVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  float sum1 [4];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar46 [64];
  float sum0 [4];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  ulong uVar167;
  ulong uVar168;
  ulong uVar169;
  ulong uVar170;
  undefined8 in_stack_fffffffffffffd98;
  Option *opt_01;
  int TILE_K;
  int TILE_N;
  Mat local_228;
  ulong local_1e0;
  long local_1d8;
  ulong local_1d0;
  uint local_1c4;
  undefined1 (*local_1c0) [16];
  Mat local_1b8;
  long local_168;
  int TILE_M;
  Mat local_158;
  uint local_10c;
  long local_108;
  long local_100;
  long local_f8;
  uint local_ec;
  int local_e8;
  int local_e4;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined1 (*local_a8) [32];
  size_t local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  auVar47 = in_ZMM2._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar7 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar7;
  }
  iVar7 = (this->super_Convolution).kernel_w;
  iVar23 = (this->super_Convolution).kernel_h;
  if (iVar23 == 1 && (iVar7 == 1 && bottom_blob->dims == 1)) {
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    if ((bottom_blob->elemsize & 0xf) == 0) {
      if (&local_158 != bottom_blob) {
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_158.data = bottom_blob->data;
        local_158.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
        local_158.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
        local_158.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
        local_158.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
        local_158.elempack = bottom_blob->elempack;
        local_158.allocator = bottom_blob->allocator;
        uVar3 = bottom_blob->d;
        local_158.d = uVar3;
      }
      local_158.dims = 3;
      local_158.w = 1;
      local_158.h = 1;
      local_158.c = bottom_blob->w;
      local_158.cstep = 1;
    }
    else {
      Mat::reshape(&local_1b8,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
      piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      local_158.data = local_1b8.data;
      local_158.refcount._0_4_ = local_1b8.refcount._0_4_;
      local_158.refcount._4_4_ = local_1b8.refcount._4_4_;
      local_158.elemsize._0_4_ = (uint)local_1b8.elemsize;
      local_158.elemsize._4_4_ = local_1b8.elemsize._4_4_;
      local_158.elempack = local_1b8.elempack;
      local_158.allocator = local_1b8.allocator;
      local_158.dims = local_1b8.dims;
      local_158.w = local_1b8.w;
      local_158.h = local_1b8.h;
      local_158.d = local_1b8.d;
      local_158.c = local_1b8.c;
      local_158.cstep = local_1b8.cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar7 = -100;
      if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
      goto LAB_001d7af9;
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    iVar7 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_158,&local_1b8,opt);
    if (iVar7 == 0) {
      if (((uint)local_1b8.elemsize & 0xf) == 0) {
        if (&local_1b8 != top_blob) {
          piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1b8.data;
          top_blob->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(uint)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
        top_blob->dims = 1;
        local_158.cstep = (size_t)local_1b8.c;
        top_blob->w = local_1b8.c;
        top_blob->h = 1;
        top_blob->c = 1;
      }
      else {
        Mat::reshape(&local_228,&local_1b8,local_1b8.c,opt->blob_allocator);
        if (&local_228 != top_blob) {
          piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_228.data;
          top_blob->refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->elemsize = local_228.elemsize;
          top_blob->elempack = local_228.elempack;
          top_blob->allocator = local_228.allocator;
          top_blob->dims = local_228.dims;
          top_blob->w = local_228.w;
          top_blob->h = local_228.h;
          top_blob->d = local_228.d;
          top_blob->c = local_228.c;
          top_blob->cstep = local_228.cstep;
        }
        piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar7 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_001d7a84;
      }
      iVar7 = 0;
    }
LAB_001d7a84:
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_001d7af9:
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.w = 0;
    local_1b8.dims = 0;
    local_1b8.elempack = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.cstep = 0;
    local_1b8.c = 0;
    piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return iVar7;
  }
  iVar22 = bottom_blob->c;
  iVar38 = (this->super_Convolution).dilation_w;
  uVar16 = bottom_blob->elemsize;
  iVar36 = (this->super_Convolution).dilation_h;
  iVar24 = bottom_blob->elempack;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_228,opt);
  iVar8 = local_228.h;
  iVar9 = -100;
  if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0))
  goto LAB_001d7e74;
  opt_01 = (Option *)CONCAT44(uVar19,local_228.w);
  iVar38 = (~((iVar7 + -1) * iVar38) + local_228.w) / (this->super_Convolution).stride_w + 1;
  iVar7 = (~((iVar23 + -1) * iVar36) + local_228.h) / (this->super_Convolution).stride_h + 1;
  lVar35 = 1;
  if (opt->use_packing_layout == true) {
    uVar14 = (this->super_Convolution).num_output;
    lVar35 = 8;
    if ((uVar14 & 7) != 0) {
      lVar35 = (ulong)((uVar14 & 3) == 0) * 3 + 1;
    }
  }
  iVar23 = (int)lVar35;
  sVar30 = lVar35 * (uVar16 / (ulong)(long)iVar24);
  Mat::create(top_blob,iVar38,iVar7,(this->super_Convolution).num_output / iVar23,sVar30,iVar23,
              opt->blob_allocator);
  uVar19 = (undefined4)(sVar30 >> 0x20);
  iVar9 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001d7e74;
  if (((opt->use_packing_layout == false) &&
      ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
          (iVar36 = (this->super_Convolution).dilation_w, iVar36 != 1)) &&
         (iVar9 = (this->super_Convolution).dilation_h, iVar9 == iVar36)) &&
        (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)))) &&
       (iVar36 <= iVar38)))) && (iVar9 <= iVar7)) {
    iVar9 = forwardDilation_x86(this,&local_228,top_blob,opt);
    goto LAB_001d7e74;
  }
  iVar22 = iVar22 * iVar24;
  bVar6 = opt->use_winograd23_convolution;
  if (((bVar6 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar21 = false;
  }
  else {
    bVar21 = true;
    if (iVar22 < 9) {
      bVar21 = 8 < (this->super_Convolution).num_output;
    }
  }
  auVar49._0_4_ = (this->super_Convolution).kernel_w;
  auVar49._4_4_ = (this->super_Convolution).kernel_h;
  auVar49._8_4_ = (this->super_Convolution).dilation_w;
  auVar49._12_4_ = (this->super_Convolution).dilation_h;
  if ((((auVar49 == _DAT_005f1480) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar21)))) {
    iVar7 = (this->super_Convolution).num_output;
    bVar4 = test_prefer_winograd63(iVar22,iVar7,(int)opt_01,iVar8);
    bVar5 = test_prefer_winograd23(iVar22,iVar7,(int)opt_01,iVar8);
    bVar21 = !bVar4 && !bVar5;
    if ((bVar5) &&
       (((bVar6 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
        (bVar5 = true,
        (long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)))) {
      bVar21 = true;
      bVar5 = false;
    }
    if ((bVar4) &&
       (((opt->use_winograd63_convolution != true ||
         ((this->weight_winograd63_data).data == (void *)0x0)) ||
        (bVar4 = true,
        (long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep == 0)))) {
      bVar21 = true;
      bVar4 = false;
    }
    if ((bVar21) &&
       (((opt->use_winograd43_convolution != true ||
         ((this->weight_winograd43_data).data == (void *)0x0)) ||
        ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep == 0)))) {
      if (((opt->use_winograd63_convolution == true) &&
          ((this->weight_winograd63_data).data != (void *)0x0)) &&
         ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep != 0)) {
        bVar4 = true;
      }
      else {
        bVar5 = true;
      }
      bVar21 = false;
    }
    iVar7 = this->nT;
    iVar23 = iVar7;
    if (iVar7 == 0) {
      iVar23 = opt->num_threads;
    }
    if (opt->num_threads != iVar7 && iVar7 != 0) {
      forward();
    }
    if (bVar5 == false) {
      if (bVar21) {
        iVar9 = conv3x3s1_winograd43
                          (&local_228,top_blob,&this->weight_winograd43_data,
                           &(this->super_Convolution).bias_data,iVar23,opt);
      }
      else {
        iVar9 = 0;
        if (bVar4 != false) {
          iVar9 = conv3x3s1_winograd63
                            (&local_228,top_blob,&this->weight_winograd63_data,
                             &(this->super_Convolution).bias_data,iVar23,opt);
        }
      }
    }
    else {
      iVar9 = conv3x3s1_winograd23
                        (&local_228,top_blob,&this->weight_winograd23_data,
                         &(this->super_Convolution).bias_data,iVar23,opt);
    }
    if (iVar9 == 0) {
      pLVar28 = this->activation;
      iVar9 = 0;
      if (pLVar28 != (Layer *)0x0) {
        (*pLVar28->_vptr_Layer[9])(pLVar28,top_blob,opt);
        iVar9 = 0;
      }
    }
    goto LAB_001d7e74;
  }
  iVar8 = get_cpu_level2_cache_size();
  iVar7 = (this->super_Convolution).num_output;
  auVar59._0_4_ = (this->super_Convolution).kernel_w;
  auVar59._4_4_ = (this->super_Convolution).kernel_h;
  auVar59._8_4_ = (this->super_Convolution).dilation_w;
  auVar59._12_4_ = (this->super_Convolution).dilation_h;
  iVar38 = (this->super_Convolution).stride_w;
  iVar36 = (this->super_Convolution).stride_h;
  opt_00 = (Option *)CONCAT44(uVar19,auVar59._0_4_);
  if ((opt->use_sgemm_convolution != true) ||
     (auVar59._0_4_ * auVar59._4_4_ * auVar59._12_4_ * iVar36 *
      iVar22 * iVar7 * auVar59._8_4_ * iVar38 * 8 <= iVar8 && (iVar22 < 0x11 && iVar7 < 0x11))) {
    auVar48._8_4_ = 1;
    auVar48._0_8_ = 0x100000001;
    auVar48._12_4_ = 1;
    auVar49 = vpcmpeqd_avx(auVar59,auVar48);
    auVar49 = vpmovsxdq_avx(auVar49);
    auVar47 = vpcmpeqd_avx(auVar47,auVar47);
    if (((auVar47 & ~auVar49) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar47 & ~auVar49,0xf) < '\0') {
      if ((iVar24 == 8) && (iVar23 == 8)) {
        if ((iVar36 == 1 && iVar38 == 1) && auVar59 == _DAT_005f1480) {
          conv3x3s1_pack8_avx(&local_228,top_blob,&this->weight_data_tm,
                              &(this->super_Convolution).bias_data,opt_00);
        }
        else {
          auVar49 = vpcmpeqd_avx(auVar59,_DAT_005f1480);
          uVar19 = vmovmskps_avx(auVar49);
          auVar55._8_4_ = 2;
          auVar55._0_8_ = 0x200000002;
          auVar55._12_4_ = 2;
          auVar49 = vpcmpeqd_avx(auVar59,auVar55);
          auVar49 = vpmovsxdq_avx(auVar49);
          if (((((((auVar47 & ~auVar49) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 -1 < SUB161(auVar47 & ~auVar49,0xf)) && iVar38 == 1) && iVar36 == 1) &
              (byte)uVar19 >> 2 & (byte)uVar19 >> 3) != 1) goto LAB_001d7be1;
          conv2x2s1_pack8_avx(&local_228,top_blob,&this->weight_data_tm,
                              &(this->super_Convolution).bias_data,opt_00);
        }
LAB_001d7d67:
        pLVar28 = this->activation;
        if (pLVar28 != (Layer *)0x0) {
LAB_001d7d73:
          (*pLVar28->_vptr_Layer[9])(pLVar28,top_blob,opt);
        }
      }
      else {
LAB_001d7be1:
        if ((iVar24 == 1) && (iVar23 == 8)) {
          auVar47 = vpcmpeqd_avx(auVar59,_DAT_005f1480);
          uVar14 = vmovmskps_avx(auVar47);
          if (iVar36 == 1 && (iVar38 == 1 && (uVar14 ^ 0xf) == 0)) {
            conv3x3s1_pack1to8_avx
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
          }
          else {
            if ((iVar36 != 2 || iVar38 != 2) || (char)(uVar14 ^ 0xf) != '\0') goto LAB_001d7c8e;
            conv3x3s2_pack1to8_avx
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
          }
          goto LAB_001d7d67;
        }
LAB_001d7c8e:
        uVar14 = auVar59._0_4_ ^ 3;
        uVar29 = auVar59._4_4_ ^ 3;
        uVar15 = auVar59._8_4_ ^ 1;
        uVar39 = auVar59._12_4_ ^ 1;
        if (iVar36 == 1 &&
            (iVar38 == 1 &&
            ((uVar15 == 0 && uVar39 == 0) &&
            (((iVar23 == 1 && iVar24 == 8) && uVar14 == 0) && uVar29 == 0)))) {
          conv3x3s1_pack8to1_avx
                    (&local_228,top_blob,&this->weight_data_tm,&(this->super_Convolution).bias_data,
                     opt_00);
LAB_001d7cf5:
          pLVar28 = this->activation;
          if (pLVar28 == (Layer *)0x0) goto LAB_001d7d7f;
          goto LAB_001d7d73;
        }
        if ((iVar24 == 1) && (iVar23 == 4)) {
          if ((iVar38 == 1 && iVar36 == 1) &&
              (((uVar14 == 0 && uVar29 == 0) && uVar15 == 0) && uVar39 == 0)) {
            conv3x3s1_pack1to4_sse
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
            goto LAB_001d7d67;
          }
          if ((((uVar14 == 0 && uVar29 == 0) && uVar15 == 0) && uVar39 == 0) &&
              (iVar36 == 2 && iVar38 == 2)) {
            conv3x3s2_pack1to4_sse
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
            goto LAB_001d7cf5;
          }
        }
        convolution_packed(&local_228,top_blob,&this->weight_data_tm,
                           &(this->super_Convolution).bias_data,auVar59._0_4_,auVar59._4_4_,
                           auVar59._8_4_,auVar59._12_4_,iVar38,iVar36,
                           (this->super_Convolution).activation_type,
                           &(this->super_Convolution).activation_params,opt_01);
      }
LAB_001d7d7f:
      iVar9 = 0;
      goto LAB_001d7e74;
    }
  }
  uVar14 = this->nT;
  uVar29 = uVar14;
  if (uVar14 == 0) {
    uVar29 = opt->num_threads;
  }
  if (opt->num_threads != uVar14 && uVar14 != 0) {
    forward();
  }
  uVar14 = (this->super_Convolution).kernel_w;
  local_b0 = (ulong)uVar14;
  uVar15 = (this->super_Convolution).kernel_h;
  local_b8 = (ulong)uVar15;
  local_c0 = (ulong)(uint)(this->super_Convolution).dilation_w;
  local_c8 = (ulong)(uint)(this->super_Convolution).dilation_h;
  local_d0 = (ulong)(uint)(this->super_Convolution).stride_w;
  local_d8 = (ulong)(uint)(this->super_Convolution).stride_h;
  uVar39 = top_blob->elempack * top_blob->c;
  uVar40 = top_blob->h * top_blob->w;
  uVar16 = (ulong)uVar40;
  iVar23 = uVar15 * uVar14 * local_228.c * local_228.elempack;
  local_98 = (ulong)uVar29;
  convolution_im2col_gemm_get_optimal_tile_mnk(uVar39,uVar40,iVar23,&TILE_M,&TILE_N,&TILE_K,uVar29);
  local_ec = (int)(uVar39 + TILE_M + -1) / TILE_M;
  iVar22 = (int)(uVar40 + TILE_N + -1) / TILE_N;
  iVar7 = (iVar23 + TILE_K + -1) / TILE_K;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_168 = CONCAT44(local_168._4_4_,iVar7);
  Mat::create(&local_158,TILE_K * TILE_N,iVar7,iVar22,4,opt->workspace_allocator);
  iVar9 = -100;
  if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
    iVar22 = iVar22 * (int)local_168;
    local_1c0 = (undefined1 (*) [16])CONCAT44(local_1c0._4_4_,iVar22);
    local_70 = uVar16;
    local_68 = (ulong)uVar39;
    if (0 < iVar22) {
      iVar7 = (int)local_b0;
      iVar22 = (int)local_b8;
      bVar4 = iVar22 == 1 && iVar7 == 1;
      bVar6 = (int)local_c8 == 1 && (int)local_c0 == 1;
      bVar5 = (int)local_d8 == 1 && (int)local_d0 == 1;
      local_f8 = CONCAT71(local_f8._1_7_,(bVar4 && bVar6) && bVar5);
      bVar21 = (int)local_d8 == 2 && (int)local_d0 == 2;
      local_80 = CONCAT71(local_80._1_7_,bVar4 && bVar21);
      bVar4 = (iVar22 == 3 && iVar7 == 3) && bVar6;
      local_90 = CONCAT71(local_90._1_7_,bVar4 && bVar5);
      local_10c = CONCAT31(local_10c._1_3_,bVar4 && bVar21);
      bVar4 = (iVar22 == 5 && iVar7 == 5) && bVar6;
      local_108 = CONCAT71(local_108._1_7_,bVar5 && bVar4);
      local_100 = CONCAT71(local_100._1_7_,bVar4 && bVar21);
      local_e0 = CONCAT71(local_e0._1_7_,((iVar22 == 7 && iVar7 == 7) && bVar6) && bVar21);
      iVar7 = 0;
      do {
        iVar22 = TILE_N * (iVar7 / (int)local_168);
        uVar29 = TILE_K * (int)((long)iVar7 % (long)(int)local_168);
        uVar14 = (int)uVar16 - iVar22;
        if (TILE_N < (int)uVar14) {
          uVar14 = TILE_N;
        }
        iVar38 = iVar23 - uVar29;
        if (TILE_K < (int)(iVar23 - uVar29)) {
          iVar38 = TILE_K;
        }
        local_1b8.cstep = (size_t)local_158.w;
        local_1b8.data =
             (void *)((long)local_158.data +
                     ((long)iVar7 % (long)(int)local_168 & 0xffffffffU) * local_1b8.cstep *
                     CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) +
                     (long)(iVar7 / (int)local_168) * local_158.cstep *
                     CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = (undefined4)local_158.elemsize;
        local_1b8.elemsize._4_4_ = local_158.elemsize._4_4_;
        local_1b8.elempack = local_158.elempack;
        local_1b8.allocator = local_158.allocator;
        local_1b8.dims = 2;
        local_1b8.w = local_158.w;
        local_1b8.h = 1;
        local_1b8.d = 1;
        local_1b8.c = 1;
        if ((char)local_f8 == '\0') {
          if ((char)local_80 == '\0') {
            if ((char)local_90 != '\0') {
              uVar170 = 1;
              uVar16 = 1;
LAB_001d523b:
              uVar13 = 3;
              goto LAB_001d5242;
            }
            if ((char)local_10c != '\0') {
              uVar170 = 2;
              uVar16 = 2;
              goto LAB_001d523b;
            }
            if ((char)local_108 != '\0') {
              uVar170 = 1;
              uVar16 = 1;
LAB_001d5340:
              uVar13 = 5;
              goto LAB_001d5242;
            }
            if ((char)local_100 != '\0') {
              uVar170 = 2;
              uVar16 = 2;
              goto LAB_001d5340;
            }
            uVar13 = local_b0;
            uVar167 = local_b8;
            uVar168 = local_c0;
            uVar169 = local_c8;
            uVar16 = local_d0;
            uVar170 = local_d8;
            if ((char)local_e0 != '\0') {
              uVar170 = 2;
              uVar16 = 2;
              uVar13 = 7;
              goto LAB_001d5242;
            }
          }
          else {
            uVar170 = 2;
            uVar16 = 2;
            uVar13 = 1;
LAB_001d5242:
            uVar167 = uVar13;
            uVar168 = 1;
            uVar169 = 1;
          }
          convolution_im2col_input_tile_impl
                    (&local_228,&local_1b8,iVar22,uVar14,uVar29,iVar38,(int)uVar13,(int)uVar167,
                     (int)uVar168,(int)uVar169,(int)uVar16,(int)uVar170);
        }
        else {
          lVar35 = 0;
          lVar10 = (long)(int)uVar29;
          lVar27 = (long)iVar22;
          local_1d8 = CONCAT44(local_1d8._4_4_,uVar14);
          local_1e0 = CONCAT44(local_1e0._4_4_,local_228.elempack);
          pauVar20 = (undefined1 (*) [32])local_1b8.data;
          if (0xb < (int)uVar14) {
            iVar22 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar22 = iVar38;
            }
            iVar36 = iVar38 + 7;
            if (-1 < iVar38) {
              iVar36 = iVar38;
            }
            uVar39 = uVar29 + 3;
            uVar15 = uVar29 + 7;
            if (-1 < (int)uVar29) {
              uVar39 = uVar29;
              uVar15 = uVar29;
            }
            lVar31 = 0;
            do {
              if (7 < iVar38 && local_228.elempack == 8) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar31 + lVar27) * 0x20 +
                           local_228.cstep * (long)((int)uVar15 >> 3) * local_228.elemsize);
                iVar24 = iVar36 >> 3;
                do {
                  auVar75 = vunpcklps_avx(*pauVar11,pauVar11[1]);
                  auVar152 = vunpckhps_avx(*pauVar11,pauVar11[1]);
                  auVar111 = vunpcklps_avx(pauVar11[2],pauVar11[3]);
                  auVar65 = vunpckhps_avx(pauVar11[2],pauVar11[3]);
                  auVar134 = vunpcklps_avx(pauVar11[4],pauVar11[5]);
                  auVar56 = vunpckhps_avx(pauVar11[4],pauVar11[5]);
                  auVar93 = vunpcklps_avx(pauVar11[6],pauVar11[7]);
                  auVar153 = vunpckhps_avx(pauVar11[6],pauVar11[7]);
                  auVar112 = vunpcklps_avx(pauVar11[8],pauVar11[9]);
                  auVar84 = vunpckhps_avx(pauVar11[8],pauVar11[9]);
                  auVar122 = vunpcklps_avx(pauVar11[10],pauVar11[0xb]);
                  auVar154 = vunpckhps_avx(pauVar11[10],pauVar11[0xb]);
                  auVar92 = vunpcklpd_avx(auVar75,auVar111);
                  auVar75 = vunpckhpd_avx(auVar75,auVar111);
                  auVar111 = vunpcklpd_avx(auVar152,auVar65);
                  auVar152 = vunpckhpd_avx(auVar152,auVar65);
                  auVar97 = vunpcklpd_avx(auVar134,auVar93);
                  auVar65 = vunpckhpd_avx(auVar134,auVar93);
                  auVar134 = vunpcklpd_avx(auVar56,auVar153);
                  auVar56 = vunpckhpd_avx(auVar56,auVar153);
                  auVar93 = vunpcklpd_avx(auVar112,auVar122);
                  auVar153 = vunpckhpd_avx(auVar112,auVar122);
                  auVar112 = vunpcklpd_avx(auVar84,auVar154);
                  auVar84 = vunpckhpd_avx(auVar84,auVar154);
                  auVar122._16_16_ = auVar97._0_16_;
                  auVar122._0_16_ = auVar92._0_16_;
                  auVar154 = vperm2f128_avx(auVar92,auVar97,0x31);
                  auVar129._16_16_ = auVar75._0_16_;
                  auVar129._0_16_ = auVar93._0_16_;
                  auVar75 = vperm2f128_avx(auVar93,auVar75,0x31);
                  auVar92._16_16_ = auVar153._0_16_;
                  auVar92._0_16_ = auVar65._0_16_;
                  auVar65 = vperm2f128_avx(auVar65,auVar153,0x31);
                  auVar97._16_16_ = auVar134._0_16_;
                  auVar97._0_16_ = auVar111._0_16_;
                  auVar153 = vperm2f128_avx(auVar111,auVar134,0x31);
                  auVar134._16_16_ = auVar152._0_16_;
                  auVar134._0_16_ = auVar112._0_16_;
                  auVar152 = vperm2f128_avx(auVar112,auVar152,0x31);
                  auVar111._16_16_ = auVar84._0_16_;
                  auVar111._0_16_ = auVar56._0_16_;
                  auVar56 = vperm2f128_avx(auVar56,auVar84,0x31);
                  *pauVar20 = auVar122;
                  pauVar20[1] = auVar129;
                  pauVar20[2] = auVar92;
                  pauVar20[3] = auVar97;
                  pauVar20[4] = auVar134;
                  pauVar20[5] = auVar111;
                  pauVar20[6] = auVar154;
                  pauVar20[7] = auVar75;
                  pauVar20[8] = auVar65;
                  pauVar20[9] = auVar153;
                  pauVar20[10] = auVar152;
                  pauVar20[0xb] = auVar56;
                  pauVar20 = pauVar20 + 0xc;
                  pauVar11 = pauVar11 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (3 < iVar38 && local_228.elempack == 4) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar31 + lVar27) * 0x10 +
                           local_228.cstep * (long)((int)uVar39 >> 2) * local_228.elemsize);
                iVar24 = iVar22 >> 2;
                do {
                  auVar59 = vpunpckldq_avx(*pauVar12,pauVar12[1]);
                  auVar48 = vpunpckldq_avx(pauVar12[2],pauVar12[3]);
                  auVar47 = vpunpckhdq_avx(*pauVar12,pauVar12[1]);
                  auVar49 = vpunpckhdq_avx(pauVar12[2],pauVar12[3]);
                  auVar55 = vpunpcklqdq_avx(auVar59,auVar48);
                  auVar59 = vpunpckhqdq_avx(auVar59,auVar48);
                  auVar48 = vpunpcklqdq_avx(auVar47,auVar49);
                  auVar47 = vpunpckhqdq_avx(auVar47,auVar49);
                  auVar49 = vunpcklps_avx(pauVar12[4],pauVar12[5]);
                  auVar143 = vunpcklps_avx(pauVar12[6],pauVar12[7]);
                  auVar141 = vunpckhps_avx(pauVar12[4],pauVar12[5]);
                  auVar142 = vunpckhps_avx(pauVar12[6],pauVar12[7]);
                  auVar145 = vunpcklpd_avx(auVar49,auVar143);
                  auVar49 = vunpckhpd_avx(auVar49,auVar143);
                  auVar146 = vunpcklpd_avx(auVar141,auVar142);
                  auVar141 = vunpckhpd_avx(auVar141,auVar142);
                  auVar142 = vunpcklps_avx(pauVar12[8],pauVar12[9]);
                  auVar147 = vunpcklps_avx(pauVar12[10],pauVar12[0xb]);
                  auVar143 = vunpckhps_avx(pauVar12[8],pauVar12[9]);
                  auVar144 = vunpckhps_avx(pauVar12[10],pauVar12[0xb]);
                  auVar101 = vunpcklpd_avx(auVar142,auVar147);
                  auVar142 = vunpckhpd_avx(auVar142,auVar147);
                  auVar147 = vunpcklpd_avx(auVar143,auVar144);
                  auVar143 = vunpckhpd_avx(auVar143,auVar144);
                  *(undefined1 (*) [16])*pauVar20 = auVar55;
                  *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar145;
                  *(undefined1 (*) [16])pauVar20[1] = auVar101;
                  *(undefined1 (*) [16])(pauVar20[1] + 0x10) = auVar59;
                  *(undefined1 (*) [16])pauVar20[2] = auVar49;
                  *(undefined1 (*) [16])(pauVar20[2] + 0x10) = auVar142;
                  *(undefined1 (*) [16])pauVar20[3] = auVar48;
                  *(undefined1 (*) [16])(pauVar20[3] + 0x10) = auVar146;
                  *(undefined1 (*) [16])pauVar20[4] = auVar147;
                  *(undefined1 (*) [16])(pauVar20[4] + 0x10) = auVar47;
                  *(undefined1 (*) [16])pauVar20[5] = auVar141;
                  *(undefined1 (*) [16])(pauVar20[5] + 0x10) = auVar143;
                  pauVar20 = pauVar20 + 6;
                  pauVar12 = pauVar12 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar38) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           lVar27 * 4 + lVar31 * 4 + local_228.cstep * lVar10 * local_228.elemsize);
                iVar24 = iVar38;
                do {
                  auVar47 = *(undefined1 (*) [16])pauVar11[1];
                  *pauVar20 = *pauVar11;
                  *(undefined1 (*) [16])pauVar20[1] = auVar47;
                  pauVar20 = (undefined1 (*) [32])(pauVar20[1] + 0x10);
                  pauVar11 = (undefined1 (*) [32])(*pauVar11 + local_228.cstep * 4);
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              lVar35 = lVar31 + 0xc;
              uVar16 = lVar31 + 0x17;
              lVar31 = lVar35;
            } while (uVar16 < uVar14);
          }
          lVar31 = (long)(int)uVar14;
          if ((int)lVar35 + 7 < (int)uVar14) {
            local_88 = CONCAT71(local_88._1_7_,iVar38 < 1);
            iVar22 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar22 = iVar38;
            }
            iVar36 = iVar38 + 7;
            if (-1 < iVar38) {
              iVar36 = iVar38;
            }
            uVar39 = uVar29 + 3;
            uVar15 = uVar29 + 7;
            if (-1 < (int)uVar29) {
              uVar39 = uVar29;
              uVar15 = uVar29;
            }
            lVar37 = (long)(int)lVar35;
            do {
              if (7 < iVar38 && local_228.elempack == 8) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar27 + lVar37) * 0x20 +
                           local_228.cstep * (long)((int)uVar15 >> 3) * local_228.elemsize);
                iVar24 = iVar36 >> 3;
                do {
                  auVar75 = vunpcklps_avx(*pauVar11,pauVar11[1]);
                  auVar152 = vunpckhps_avx(*pauVar11,pauVar11[1]);
                  auVar154 = vunpcklps_avx(pauVar11[2],pauVar11[3]);
                  auVar65 = vunpckhps_avx(pauVar11[2],pauVar11[3]);
                  auVar111 = vunpcklps_avx(pauVar11[4],pauVar11[5]);
                  auVar56 = vunpckhps_avx(pauVar11[4],pauVar11[5]);
                  auVar97 = vunpcklps_avx(pauVar11[6],pauVar11[7]);
                  auVar153 = vunpckhps_avx(pauVar11[6],pauVar11[7]);
                  auVar84 = vunpcklpd_avx(auVar75,auVar154);
                  auVar75 = vunpckhpd_avx(auVar75,auVar154);
                  auVar154 = vunpcklpd_avx(auVar152,auVar65);
                  auVar152 = vunpckhpd_avx(auVar152,auVar65);
                  auVar92 = vunpcklpd_avx(auVar111,auVar97);
                  auVar65 = vunpckhpd_avx(auVar111,auVar97);
                  auVar111 = vunpcklpd_avx(auVar56,auVar153);
                  auVar56 = vunpckhpd_avx(auVar56,auVar153);
                  auVar93._16_16_ = auVar92._0_16_;
                  auVar93._0_16_ = auVar84._0_16_;
                  auVar112._16_16_ = auVar65._0_16_;
                  auVar112._0_16_ = auVar75._0_16_;
                  auVar123._16_16_ = auVar111._0_16_;
                  auVar123._0_16_ = auVar154._0_16_;
                  auVar130._16_16_ = auVar56._0_16_;
                  auVar130._0_16_ = auVar152._0_16_;
                  auVar153 = vperm2f128_avx(auVar84,auVar92,0x31);
                  auVar75 = vperm2f128_avx(auVar75,auVar65,0x31);
                  auVar65 = vperm2f128_avx(auVar154,auVar111,0x31);
                  auVar152 = vperm2f128_avx(auVar152,auVar56,0x31);
                  *pauVar20 = auVar93;
                  pauVar20[1] = auVar112;
                  pauVar20[2] = auVar123;
                  pauVar20[3] = auVar130;
                  pauVar20[4] = auVar153;
                  pauVar20[5] = auVar75;
                  pauVar20[6] = auVar65;
                  pauVar20[7] = auVar152;
                  pauVar20 = pauVar20 + 8;
                  pauVar11 = pauVar11 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (3 < iVar38 && local_228.elempack == 4) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar27 + lVar37) * 0x10 +
                           local_228.cstep * (long)((int)uVar39 >> 2) * local_228.elemsize);
                iVar24 = iVar22 >> 2;
                do {
                  auVar59 = vpunpckldq_avx(*pauVar12,pauVar12[1]);
                  auVar48 = vpunpckldq_avx(pauVar12[2],pauVar12[3]);
                  auVar47 = vpunpckhdq_avx(*pauVar12,pauVar12[1]);
                  auVar49 = vpunpckhdq_avx(pauVar12[2],pauVar12[3]);
                  auVar55 = vpunpcklqdq_avx(auVar59,auVar48);
                  auVar59 = vpunpckhqdq_avx(auVar59,auVar48);
                  auVar48 = vpunpcklqdq_avx(auVar47,auVar49);
                  auVar47 = vpunpckhqdq_avx(auVar47,auVar49);
                  auVar49 = vunpcklps_avx(pauVar12[4],pauVar12[5]);
                  auVar144 = vunpcklps_avx(pauVar12[6],pauVar12[7]);
                  auVar141 = vunpckhps_avx(pauVar12[4],pauVar12[5]);
                  auVar142 = vunpckhps_avx(pauVar12[6],pauVar12[7]);
                  auVar143 = vunpcklpd_avx(auVar49,auVar144);
                  auVar49 = vunpckhpd_avx(auVar49,auVar144);
                  auVar144 = vunpcklpd_avx(auVar141,auVar142);
                  auVar141 = vunpckhpd_avx(auVar141,auVar142);
                  *(undefined1 (*) [16])*pauVar20 = auVar55;
                  *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar143;
                  *(undefined1 (*) [16])pauVar20[1] = auVar59;
                  *(undefined1 (*) [16])(pauVar20[1] + 0x10) = auVar49;
                  *(undefined1 (*) [16])pauVar20[2] = auVar48;
                  *(undefined1 (*) [16])(pauVar20[2] + 0x10) = auVar144;
                  *(undefined1 (*) [16])pauVar20[3] = auVar47;
                  *(undefined1 (*) [16])(pauVar20[3] + 0x10) = auVar141;
                  pauVar20 = pauVar20 + 4;
                  pauVar12 = pauVar12 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (local_228.elempack == 1 && iVar38 >= 1) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           lVar27 * 4 + lVar37 * 4 + local_228.cstep * lVar10 * local_228.elemsize);
                iVar24 = iVar38;
                do {
                  *pauVar20 = *pauVar11;
                  pauVar20 = pauVar20 + 1;
                  pauVar11 = (undefined1 (*) [32])(*pauVar11 + local_228.cstep * 4);
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              lVar35 = lVar37 + 8;
              bVar6 = lVar37 < lVar31 + -0xf;
              lVar37 = lVar35;
            } while (bVar6);
          }
          if ((int)((uint)lVar35 | 3) < (int)uVar14) {
            iVar22 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar22 = iVar38;
            }
            iVar36 = iVar38 + 7;
            if (-1 < iVar38) {
              iVar36 = iVar38;
            }
            uVar39 = uVar29 + 3;
            uVar15 = uVar29 + 7;
            if (-1 < (int)uVar29) {
              uVar39 = uVar29;
              uVar15 = uVar29;
            }
            lVar37 = (long)(int)(uint)lVar35;
            do {
              if (7 < iVar38 && local_228.elempack == 8) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar37 + lVar27) * 0x20 +
                           local_228.cstep * (long)((int)uVar15 >> 3) * local_228.elemsize);
                iVar24 = iVar36 >> 3;
                do {
                  auVar75 = vunpcklps_avx(*pauVar11,pauVar11[1]);
                  auVar152 = vunpckhps_avx(*pauVar11,pauVar11[1]);
                  auVar153 = vunpcklps_avx(pauVar11[2],pauVar11[3]);
                  auVar65 = vunpckhps_avx(pauVar11[2],pauVar11[3]);
                  auVar56 = vunpcklpd_avx(auVar75,auVar153);
                  auVar75 = vunpckhpd_avx(auVar75,auVar153);
                  auVar153 = vunpcklpd_avx(auVar152,auVar65);
                  auVar152 = vunpckhpd_avx(auVar152,auVar65);
                  auVar65._16_16_ = auVar75._0_16_;
                  auVar65._0_16_ = auVar56._0_16_;
                  auVar84._16_16_ = auVar152._0_16_;
                  auVar84._0_16_ = auVar153._0_16_;
                  auVar75 = vperm2f128_avx(auVar56,auVar75,0x31);
                  auVar152 = vperm2f128_avx(auVar153,auVar152,0x31);
                  *pauVar20 = auVar65;
                  pauVar20[1] = auVar84;
                  pauVar20[2] = auVar75;
                  pauVar20[3] = auVar152;
                  pauVar20 = pauVar20 + 4;
                  pauVar11 = pauVar11 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (3 < iVar38 && local_228.elempack == 4) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar37 + lVar27) * 0x10 +
                           local_228.cstep * (long)((int)uVar39 >> 2) * local_228.elemsize);
                iVar24 = iVar22 >> 2;
                do {
                  auVar59 = vpunpckldq_avx(*pauVar12,pauVar12[1]);
                  auVar48 = vpunpckldq_avx(pauVar12[2],pauVar12[3]);
                  auVar47 = vpunpckhdq_avx(*pauVar12,pauVar12[1]);
                  auVar49 = vpunpckhdq_avx(pauVar12[2],pauVar12[3]);
                  auVar55 = vpunpcklqdq_avx(auVar59,auVar48);
                  auVar59 = vpunpckhqdq_avx(auVar59,auVar48);
                  auVar48 = vpunpcklqdq_avx(auVar47,auVar49);
                  auVar47 = vpunpckhqdq_avx(auVar47,auVar49);
                  *(undefined1 (*) [16])*pauVar20 = auVar55;
                  *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar59;
                  *(undefined1 (*) [16])pauVar20[1] = auVar48;
                  *(undefined1 (*) [16])(pauVar20[1] + 0x10) = auVar47;
                  pauVar20 = pauVar20 + 2;
                  pauVar12 = pauVar12 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar38) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           lVar27 * 4 + lVar37 * 4 + local_228.cstep * lVar10 * local_228.elemsize);
                iVar24 = iVar38;
                do {
                  *(undefined1 (*) [16])*pauVar20 = *pauVar12;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
                  pauVar12 = (undefined1 (*) [16])(*pauVar12 + local_228.cstep * 4);
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              lVar35 = lVar37 + 4;
              lVar33 = lVar37 + 7;
              lVar37 = lVar35;
            } while (lVar33 < lVar31);
          }
          uVar15 = (uint)lVar35;
          if ((int)(uVar15 | 1) < (int)uVar14) {
            iVar22 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar22 = iVar38;
            }
            iVar36 = iVar38 + 7;
            if (-1 < iVar38) {
              iVar36 = iVar38;
            }
            uVar40 = uVar29 + 3;
            uVar39 = uVar29 + 7;
            if (-1 < (int)uVar29) {
              uVar40 = uVar29;
              uVar39 = uVar29;
            }
            lVar37 = lVar27 * 4 + (long)(int)uVar15 * 4;
            lVar33 = (long)(int)uVar15;
            do {
              if (7 < iVar38 && local_228.elempack == 8) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar33 + lVar27) * 0x20 +
                           local_228.cstep * (long)((int)uVar39 >> 3) * local_228.elemsize);
                iVar24 = iVar36 >> 3;
                do {
                  auVar152 = vunpcklps_avx(*pauVar11,pauVar11[1]);
                  auVar75 = vunpckhps_avx(*pauVar11,pauVar11[1]);
                  auVar56._16_16_ = auVar75._0_16_;
                  auVar56._0_16_ = auVar152._0_16_;
                  auVar75 = vperm2f128_avx(auVar152,auVar75,0x31);
                  *pauVar20 = auVar56;
                  pauVar20[1] = auVar75;
                  pauVar20 = pauVar20 + 2;
                  pauVar11 = pauVar11 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (3 < iVar38 && local_228.elempack == 4) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar33 + lVar27) * 0x10 +
                           local_228.cstep * (long)((int)uVar40 >> 2) * local_228.elemsize);
                iVar24 = iVar22 >> 2;
                do {
                  auVar49 = vpunpckldq_avx(*pauVar12,pauVar12[1]);
                  auVar47 = vpunpckhdq_avx(*pauVar12,pauVar12[1]);
                  *(undefined1 (*) [16])*pauVar20 = auVar49;
                  *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar47;
                  pauVar20 = pauVar20 + 1;
                  pauVar12 = pauVar12 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar38) {
                puVar25 = (undefined4 *)
                          (local_228.cstep * lVar10 * local_228.elemsize + lVar37 +
                          (long)local_228.data);
                iVar24 = iVar38;
                do {
                  *(undefined4 *)*pauVar20 = *puVar25;
                  *(undefined4 *)(*pauVar20 + 4) = puVar25[1];
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + 8);
                  puVar25 = puVar25 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              lVar35 = lVar33 + 2;
              lVar34 = lVar33 + 3;
              lVar37 = lVar37 + 8;
              lVar33 = lVar35;
            } while (lVar34 < lVar31);
          }
          local_1d0 = (ulong)uVar29;
          if ((int)lVar35 < (int)uVar14) {
            iVar22 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar22 = iVar38;
            }
            iVar36 = iVar38 + 7;
            if (-1 < iVar38) {
              iVar36 = iVar38;
            }
            uVar14 = uVar29 + 3;
            uVar15 = uVar29 + 7;
            if (-1 < (int)uVar29) {
              uVar14 = uVar29;
              uVar15 = uVar29;
            }
            lVar37 = (long)(int)lVar35;
            lVar35 = lVar27 * 4 + lVar37 * 4;
            do {
              if (7 < iVar38 && local_228.elempack == 8) {
                pauVar11 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar37 + lVar27) * 0x20 +
                           local_228.cstep * (long)((int)uVar15 >> 3) * local_228.elemsize);
                iVar24 = iVar36 >> 3;
                do {
                  *pauVar20 = *pauVar11;
                  pauVar20 = pauVar20 + 1;
                  pauVar11 = pauVar11 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (3 < iVar38 && local_228.elempack == 4) {
                pauVar12 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar37 + lVar27) * 0x10 +
                           local_228.cstep * (long)((int)uVar14 >> 2) * local_228.elemsize);
                iVar24 = iVar22 >> 2;
                do {
                  *(undefined1 (*) [16])*pauVar20 = *pauVar12;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
                  pauVar12 = pauVar12 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar38) {
                puVar25 = (undefined4 *)
                          (local_228.cstep * lVar10 * local_228.elemsize + lVar35 +
                          (long)local_228.data);
                iVar24 = iVar38;
                do {
                  *(undefined4 *)*pauVar20 = *puVar25;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + 4);
                  puVar25 = puVar25 + local_228.cstep;
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              lVar37 = lVar37 + 1;
              lVar35 = lVar35 + 4;
            } while (lVar37 != lVar31);
          }
        }
        uVar16 = local_70;
        piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_1b8.allocator == (Allocator *)0x0) {
              if ((undefined1 (*) [32])local_1b8.data != (undefined1 (*) [32])0x0) {
                free(local_1b8.data);
              }
            }
            else {
              (*(local_1b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != (int)local_1c0);
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    if (TILE_K < iVar23) {
      Mat::create(&local_1b8,TILE_M * TILE_N,1,(int)local_98,4,opt->workspace_allocator);
      iVar9 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0))
      goto LAB_001d5507;
    }
    else {
LAB_001d5507:
      if (0 < (int)local_ec) {
        uVar170 = 0;
        do {
          uVar13 = uVar170;
          iVar7 = TILE_M;
          if (TILE_K < iVar23) {
            iVar22 = get_omp_thread_num();
            local_a8 = (undefined1 (*) [32])
                       ((long)iVar22 * local_1b8.cstep *
                        CONCAT44(local_1b8.elemsize._4_4_,(uint)local_1b8.elemsize) +
                       (long)local_1b8.data);
          }
          else {
            local_a8 = (undefined1 (*) [32])0x0;
          }
          local_e8 = iVar7 * (int)uVar13;
          local_1c4 = (int)local_68 - local_e8;
          if (iVar7 < (int)local_1c4) {
            local_1c4 = iVar7;
          }
          if (0 < (int)uVar16) {
            local_108 = (long)local_e8;
            local_50 = (ulong)local_1c4;
            local_100 = (long)(int)local_1c4;
            iVar7 = 0;
            do {
              uVar14 = (int)uVar16 - iVar7;
              if (TILE_N < (int)uVar14) {
                uVar14 = TILE_N;
              }
              if (0 < iVar23) {
                local_e0 = (long)iVar7;
                iVar22 = 0;
                do {
                  local_74 = iVar23 - iVar22;
                  local_58 = (long)TILE_K;
                  iVar38 = local_74;
                  if (TILE_K < local_74) {
                    iVar38 = TILE_K;
                  }
                  pauVar20 = (undefined1 (*) [32])(this->super_Convolution).bias_data.data;
                  sVar30 = (this->weight_sgemm_data).elemsize;
                  pauVar26 = (undefined1 (*) [32])
                             ((long)(this->weight_sgemm_data).data +
                             (long)(this->weight_sgemm_data).w * sVar30 * (long)(iVar22 / TILE_K) +
                             (long)(local_e8 / TILE_M) * (this->weight_sgemm_data).cstep * sVar30);
                  local_1c0 = (undefined1 (*) [16])
                              ((long)local_158.data +
                              (long)local_158.w *
                              CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                              (long)(iVar22 / TILE_K) +
                              (long)(iVar7 / TILE_N) * local_158.cstep *
                              CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
                  iVar8 = TILE_K + iVar22;
                  iVar36 = top_blob->elempack;
                  local_a0 = top_blob->cstep;
                  iVar24 = (int)local_a0;
                  pauVar11 = local_a8;
                  if ((int)local_1c4 < 8) {
                    uVar16 = 0;
                  }
                  else {
                    local_40 = (long)(iVar36 * iVar7);
                    lVar35 = (long)(iVar24 * 4);
                    lVar27 = (long)(iVar24 * 2);
                    local_1d0 = (long)(local_a0 * 0x300000000) >> 0x20;
                    local_1d8 = (long)((local_a0 << 0x20) * 5) >> 0x20;
                    local_1e0 = (long)((local_a0 << 0x21) * 3) >> 0x20;
                    local_168 = (long)(local_a0 * 0x700000000) >> 0x20;
                    local_80 = (long)(iVar24 * 3);
                    local_88 = (long)(iVar24 * 5);
                    local_90 = (long)(iVar24 * 6);
                    local_98 = (ulong)(iVar24 * 7);
                    local_f8 = (long)((local_a0 << 0x20) + 0x100000000) >> 0x20;
                    local_b0 = (ulong)(iVar24 * 2 + 1);
                    local_b8 = (ulong)(iVar24 * 3 + 1);
                    local_c0 = (ulong)(iVar24 * 4 + 1);
                    local_c8 = (ulong)(iVar24 * 5 + 1);
                    local_d0 = (ulong)(iVar24 * 6 + 1);
                    local_d8 = (ulong)(iVar24 * 7 + 1);
                    local_48 = (long)(iVar38 * 8) * 4;
                    lVar10 = (long)iVar24;
                    uVar16 = 0;
                    do {
                      local_38 = uVar16;
                      pauVar18 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 local_38 * 4 + local_108 * 4);
                      if (pauVar20 == (undefined1 (*) [32])0x0) {
                        pauVar18 = pauVar20;
                      }
                      pauVar20 = pauVar18;
                      uVar29 = 0;
                      pauVar18 = (undefined1 (*) [32])
                                 ((long)top_blob->data +
                                 local_40 * 4 + (local_38 + local_108) * lVar10 * 4);
                      pauVar12 = local_1c0;
                      if (0xb < (int)uVar14) {
                        uVar15 = 0;
                        do {
                          if (iVar22 == 0) {
                            if (pauVar20 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664((undefined1  [16])0x0);
                              auVar58 = ZEXT1664((undefined1  [16])0x0);
                              auVar68 = ZEXT1664((undefined1  [16])0x0);
                              auVar76 = ZEXT864(0) << 0x40;
                              auVar79 = ZEXT864(0) << 0x40;
                              auVar89 = ZEXT864(0) << 0x40;
                              auVar96 = ZEXT864(0) << 0x40;
                              auVar98 = ZEXT864(0) << 0x40;
                              auVar100 = ZEXT864(0) << 0x40;
                              auVar121 = ZEXT864(0) << 0x40;
                              auVar128 = ZEXT864(0) << 0x40;
                              auVar133 = ZEXT864(0) << 0x40;
                            }
                            else {
                              auVar75 = *pauVar20;
                              auVar46 = ZEXT3264(auVar75);
                              auVar58 = ZEXT3264(auVar75);
                              auVar68 = ZEXT3264(auVar75);
                              auVar76 = ZEXT3264(auVar75);
                              auVar79 = ZEXT3264(auVar75);
                              auVar89 = ZEXT3264(auVar75);
                              auVar96 = ZEXT3264(auVar75);
                              auVar98 = ZEXT3264(auVar75);
                              auVar100 = ZEXT3264(auVar75);
                              auVar121 = ZEXT3264(auVar75);
                              auVar128 = ZEXT3264(auVar75);
                              auVar133 = ZEXT3264(auVar75);
                            }
                          }
                          else {
                            auVar133 = ZEXT3264(*pauVar11);
                            auVar128 = ZEXT3264(pauVar11[1]);
                            auVar121 = ZEXT3264(pauVar11[2]);
                            auVar100 = ZEXT3264(pauVar11[3]);
                            auVar98 = ZEXT3264(pauVar11[4]);
                            auVar96 = ZEXT3264(pauVar11[5]);
                            auVar89 = ZEXT3264(pauVar11[6]);
                            auVar79 = ZEXT3264(pauVar11[7]);
                            auVar76 = ZEXT3264(pauVar11[8]);
                            auVar68 = ZEXT3264(pauVar11[9]);
                            auVar58 = ZEXT3264(pauVar11[10]);
                            auVar46 = ZEXT3264(pauVar11[0xb]);
                          }
                          auVar75 = auVar46._0_32_;
                          auVar152 = auVar58._0_32_;
                          auVar65 = auVar68._0_32_;
                          auVar56 = auVar76._0_32_;
                          auVar153 = auVar79._0_32_;
                          auVar84 = auVar89._0_32_;
                          auVar154 = auVar96._0_32_;
                          auVar92 = auVar98._0_32_;
                          auVar111 = auVar100._0_32_;
                          auVar97 = auVar121._0_32_;
                          auVar134 = auVar128._0_32_;
                          auVar93 = auVar133._0_32_;
                          pauVar17 = pauVar26;
                          iVar9 = iVar38;
                          if (0 < iVar38) {
                            do {
                              auVar75 = *pauVar17;
                              uVar19 = *(undefined4 *)*pauVar12;
                              auVar152._4_4_ = uVar19;
                              auVar152._0_4_ = uVar19;
                              auVar152._8_4_ = uVar19;
                              auVar152._12_4_ = uVar19;
                              auVar152._16_4_ = uVar19;
                              auVar152._20_4_ = uVar19;
                              auVar152._24_4_ = uVar19;
                              auVar152._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar133._0_32_,auVar75,auVar152);
                              auVar133 = ZEXT1664(auVar47);
                              auVar93 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(*pauVar12 + 4);
                              auVar153._4_4_ = uVar19;
                              auVar153._0_4_ = uVar19;
                              auVar153._8_4_ = uVar19;
                              auVar153._12_4_ = uVar19;
                              auVar153._16_4_ = uVar19;
                              auVar153._20_4_ = uVar19;
                              auVar153._24_4_ = uVar19;
                              auVar153._28_4_ = uVar19;
                              uVar19 = *(undefined4 *)(*pauVar12 + 8);
                              auVar162._4_4_ = uVar19;
                              auVar162._0_4_ = uVar19;
                              auVar162._8_4_ = uVar19;
                              auVar162._12_4_ = uVar19;
                              auVar162._16_4_ = uVar19;
                              auVar162._20_4_ = uVar19;
                              auVar162._24_4_ = uVar19;
                              auVar162._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar128._0_32_,auVar75,auVar153);
                              auVar128 = ZEXT1664(auVar47);
                              auVar134 = ZEXT1632(auVar47);
                              auVar47 = vfmadd231ps_fma(auVar121._0_32_,auVar75,auVar162);
                              auVar121 = ZEXT1664(auVar47);
                              auVar97 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(*pauVar12 + 0xc);
                              auVar154._4_4_ = uVar19;
                              auVar154._0_4_ = uVar19;
                              auVar154._8_4_ = uVar19;
                              auVar154._12_4_ = uVar19;
                              auVar154._16_4_ = uVar19;
                              auVar154._20_4_ = uVar19;
                              auVar154._24_4_ = uVar19;
                              auVar154._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar100._0_32_,auVar75,auVar154);
                              auVar100 = ZEXT1664(auVar47);
                              auVar111 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)pauVar12[1];
                              auVar155._4_4_ = uVar19;
                              auVar155._0_4_ = uVar19;
                              auVar155._8_4_ = uVar19;
                              auVar155._12_4_ = uVar19;
                              auVar155._16_4_ = uVar19;
                              auVar155._20_4_ = uVar19;
                              auVar155._24_4_ = uVar19;
                              auVar155._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar98._0_32_,auVar75,auVar155);
                              auVar98 = ZEXT1664(auVar47);
                              auVar92 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(pauVar12[1] + 4);
                              auVar156._4_4_ = uVar19;
                              auVar156._0_4_ = uVar19;
                              auVar156._8_4_ = uVar19;
                              auVar156._12_4_ = uVar19;
                              auVar156._16_4_ = uVar19;
                              auVar156._20_4_ = uVar19;
                              auVar156._24_4_ = uVar19;
                              auVar156._28_4_ = uVar19;
                              uVar19 = *(undefined4 *)(pauVar12[1] + 8);
                              auVar163._4_4_ = uVar19;
                              auVar163._0_4_ = uVar19;
                              auVar163._8_4_ = uVar19;
                              auVar163._12_4_ = uVar19;
                              auVar163._16_4_ = uVar19;
                              auVar163._20_4_ = uVar19;
                              auVar163._24_4_ = uVar19;
                              auVar163._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar96._0_32_,auVar75,auVar156);
                              auVar96 = ZEXT1664(auVar47);
                              auVar154 = ZEXT1632(auVar47);
                              auVar47 = vfmadd231ps_fma(auVar89._0_32_,auVar75,auVar163);
                              auVar89 = ZEXT1664(auVar47);
                              auVar84 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(pauVar12[1] + 0xc);
                              auVar157._4_4_ = uVar19;
                              auVar157._0_4_ = uVar19;
                              auVar157._8_4_ = uVar19;
                              auVar157._12_4_ = uVar19;
                              auVar157._16_4_ = uVar19;
                              auVar157._20_4_ = uVar19;
                              auVar157._24_4_ = uVar19;
                              auVar157._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar79._0_32_,auVar75,auVar157);
                              auVar79 = ZEXT1664(auVar47);
                              auVar153 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)pauVar12[2];
                              auVar158._4_4_ = uVar19;
                              auVar158._0_4_ = uVar19;
                              auVar158._8_4_ = uVar19;
                              auVar158._12_4_ = uVar19;
                              auVar158._16_4_ = uVar19;
                              auVar158._20_4_ = uVar19;
                              auVar158._24_4_ = uVar19;
                              auVar158._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar76._0_32_,auVar75,auVar158);
                              auVar76 = ZEXT1664(auVar47);
                              auVar56 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(pauVar12[2] + 4);
                              auVar159._4_4_ = uVar19;
                              auVar159._0_4_ = uVar19;
                              auVar159._8_4_ = uVar19;
                              auVar159._12_4_ = uVar19;
                              auVar159._16_4_ = uVar19;
                              auVar159._20_4_ = uVar19;
                              auVar159._24_4_ = uVar19;
                              auVar159._28_4_ = uVar19;
                              uVar19 = *(undefined4 *)(pauVar12[2] + 8);
                              auVar164._4_4_ = uVar19;
                              auVar164._0_4_ = uVar19;
                              auVar164._8_4_ = uVar19;
                              auVar164._12_4_ = uVar19;
                              auVar164._16_4_ = uVar19;
                              auVar164._20_4_ = uVar19;
                              auVar164._24_4_ = uVar19;
                              auVar164._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar68._0_32_,auVar75,auVar159);
                              auVar68 = ZEXT1664(auVar47);
                              auVar65 = ZEXT1632(auVar47);
                              auVar47 = vfmadd231ps_fma(auVar58._0_32_,auVar75,auVar164);
                              auVar58 = ZEXT1664(auVar47);
                              auVar152 = ZEXT1632(auVar47);
                              uVar19 = *(undefined4 *)(pauVar12[2] + 0xc);
                              auVar160._4_4_ = uVar19;
                              auVar160._0_4_ = uVar19;
                              auVar160._8_4_ = uVar19;
                              auVar160._12_4_ = uVar19;
                              auVar160._16_4_ = uVar19;
                              auVar160._20_4_ = uVar19;
                              auVar160._24_4_ = uVar19;
                              auVar160._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar46._0_32_,auVar75,auVar160);
                              auVar46 = ZEXT1664(auVar47);
                              auVar75 = ZEXT1632(auVar47);
                              pauVar12 = pauVar12 + 3;
                              iVar9 = iVar9 + -1;
                              pauVar17 = pauVar17 + 1;
                            } while (iVar9 != 0);
                          }
                          if (iVar8 < iVar23) {
                            *pauVar11 = auVar93;
                            pauVar11[1] = auVar134;
                            pauVar11[2] = auVar97;
                            pauVar11[3] = auVar111;
                            pauVar11[4] = auVar92;
                            pauVar11[5] = auVar154;
                            pauVar11[6] = auVar84;
                            pauVar11[7] = auVar153;
                            pauVar11[8] = auVar56;
                            pauVar11[9] = auVar65;
                            pauVar11[10] = auVar152;
                            pauVar11[0xb] = auVar75;
                          }
                          else {
                            if (iVar36 == 8) {
                              *pauVar18 = auVar93;
                              pauVar18[1] = auVar134;
                              pauVar18[2] = auVar97;
                              pauVar18[3] = auVar111;
                              pauVar18[4] = auVar92;
                              pauVar18[5] = auVar154;
                              pauVar18[6] = auVar84;
                              pauVar18[7] = auVar153;
                              pauVar18[8] = auVar56;
                              pauVar18[9] = auVar65;
                              pauVar18[10] = auVar152;
                              pauVar18[0xb] = auVar75;
                              pauVar18 = pauVar18 + 0xc;
                            }
                            auVar48 = auVar56._0_16_;
                            auVar59 = auVar65._0_16_;
                            auVar49 = auVar152._0_16_;
                            auVar47 = auVar75._0_16_;
                            if (iVar36 == 4) {
                              auVar135._16_16_ = auVar134._0_16_;
                              auVar135._0_16_ = auVar93._0_16_;
                              *pauVar18 = auVar135;
                              auVar136._16_16_ = auVar111._0_16_;
                              auVar136._0_16_ = auVar97._0_16_;
                              pauVar18[1] = auVar136;
                              auVar137._16_16_ = auVar154._0_16_;
                              auVar137._0_16_ = auVar92._0_16_;
                              pauVar18[2] = auVar137;
                              auVar138._16_16_ = auVar153._0_16_;
                              auVar138._0_16_ = auVar84._0_16_;
                              pauVar18[3] = auVar138;
                              auVar139._16_16_ = auVar59;
                              auVar139._0_16_ = auVar48;
                              pauVar18[4] = auVar139;
                              auVar140._16_16_ = auVar47;
                              auVar140._0_16_ = auVar49;
                              pauVar18[5] = auVar140;
                              auVar112 = vperm2f128_avx(auVar93,auVar134,0x31);
                              *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar112;
                              auVar112 = vperm2f128_avx(auVar97,auVar111,0x31);
                              *(undefined1 (*) [32])(pauVar18[1] + lVar35 * 4) = auVar112;
                              auVar112 = vperm2f128_avx(auVar92,auVar154,0x31);
                              *(undefined1 (*) [32])(pauVar18[2] + lVar35 * 4) = auVar112;
                              auVar112 = vperm2f128_avx(auVar84,auVar153,0x31);
                              *(undefined1 (*) [32])(pauVar18[3] + lVar35 * 4) = auVar112;
                              auVar112 = vperm2f128_avx(auVar56,auVar65,0x31);
                              *(undefined1 (*) [32])(pauVar18[4] + lVar35 * 4) = auVar112;
                              auVar112 = vperm2f128_avx(auVar152,auVar75,0x31);
                              *(undefined1 (*) [32])(pauVar18[5] + lVar35 * 4) = auVar112;
                              pauVar18 = pauVar18 + 6;
                            }
                            if (iVar36 == 1) {
                              auVar112 = vunpcklps_avx(auVar93,auVar134);
                              auVar134 = vunpckhps_avx(auVar93,auVar134);
                              auVar122 = vunpcklps_avx(auVar97,auVar111);
                              auVar111 = vunpckhps_avx(auVar97,auVar111);
                              auVar129 = vunpcklps_avx(auVar92,auVar154);
                              auVar92 = vunpckhps_avx(auVar92,auVar154);
                              auVar154 = vunpcklps_avx(auVar84,auVar153);
                              auVar97 = vunpckhps_avx(auVar84,auVar153);
                              auVar93 = vunpcklpd_avx(auVar112,auVar122);
                              auVar153 = vunpckhpd_avx(auVar112,auVar122);
                              auVar112 = vunpcklpd_avx(auVar134,auVar111);
                              auVar84 = vunpckhpd_avx(auVar134,auVar111);
                              auVar111 = vunpcklpd_avx(auVar129,auVar154);
                              auVar154 = vunpckhpd_avx(auVar129,auVar154);
                              auVar134 = vunpcklpd_avx(auVar92,auVar97);
                              auVar92 = vunpckhpd_avx(auVar92,auVar97);
                              auVar94._16_16_ = auVar111._0_16_;
                              auVar94._0_16_ = auVar93._0_16_;
                              auVar161._16_16_ = auVar154._0_16_;
                              auVar161._0_16_ = auVar153._0_16_;
                              auVar165._16_16_ = auVar134._0_16_;
                              auVar165._0_16_ = auVar112._0_16_;
                              auVar166._16_16_ = auVar92._0_16_;
                              auVar166._0_16_ = auVar84._0_16_;
                              auVar111 = vperm2f128_avx(auVar93,auVar111,0x31);
                              auVar153 = vperm2f128_avx(auVar153,auVar154,0x31);
                              auVar154 = vperm2f128_avx(auVar112,auVar134,0x31);
                              auVar84 = vperm2f128_avx(auVar84,auVar92,0x31);
                              *pauVar18 = auVar94;
                              *(undefined1 (*) [32])(*pauVar18 + lVar10 * 4) = auVar161;
                              *(undefined1 (*) [32])(*pauVar18 + lVar27 * 4) = auVar165;
                              *(undefined1 (*) [32])(*pauVar18 + local_1d0 * 4) = auVar166;
                              *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar111;
                              *(undefined1 (*) [32])(*pauVar18 + local_1d8 * 4) = auVar153;
                              *(undefined1 (*) [32])(*pauVar18 + local_1e0 * 4) = auVar154;
                              *(undefined1 (*) [32])(*pauVar18 + local_168 * 4) = auVar84;
                              auVar55 = vunpcklps_avx(auVar48,auVar59);
                              auVar141 = vunpcklps_avx(auVar49,auVar47);
                              auVar59 = vunpckhps_avx(auVar48,auVar59);
                              auVar48 = vunpckhps_avx(auVar49,auVar47);
                              auVar47 = vmovlhps_avx(auVar55,auVar141);
                              auVar55 = vunpckhpd_avx(auVar55,auVar141);
                              auVar49 = vmovlhps_avx(auVar59,auVar48);
                              auVar141 = vunpckhpd_avx(auVar59,auVar48);
                              auVar48 = vunpcklps_avx(auVar56._16_16_,auVar65._16_16_);
                              auVar142 = vunpcklps_avx(auVar152._16_16_,auVar75._16_16_);
                              auVar143 = vunpckhps_avx(auVar56._16_16_,auVar65._16_16_);
                              auVar144 = vunpckhps_avx(auVar152._16_16_,auVar75._16_16_);
                              auVar59 = vmovlhps_avx(auVar48,auVar142);
                              auVar142 = vunpckhpd_avx(auVar48,auVar142);
                              auVar48 = vmovlhps_avx(auVar143,auVar144);
                              auVar143 = vunpckhpd_avx(auVar143,auVar144);
                              *(undefined1 (*) [16])pauVar18[1] = auVar47;
                              *(undefined1 (*) [16])(pauVar18[1] + lVar10 * 4) = auVar55;
                              *(undefined1 (*) [16])(pauVar18[1] + lVar27 * 4) = auVar49;
                              *(undefined1 (*) [16])(pauVar18[1] + local_1d0 * 4) = auVar141;
                              *(undefined1 (*) [16])(pauVar18[1] + lVar35 * 4) = auVar59;
                              *(undefined1 (*) [16])(pauVar18[1] + local_1d8 * 4) = auVar142;
                              *(undefined1 (*) [16])(pauVar18[1] + local_1e0 * 4) = auVar48;
                              *(undefined1 (*) [16])(pauVar18[1] + local_168 * 4) = auVar143;
                              pauVar18 = (undefined1 (*) [32])(pauVar18[1] + 0x10);
                            }
                          }
                          pauVar11 = pauVar11 + 0xc;
                          uVar29 = uVar15 + 0xc;
                          iVar9 = uVar15 + 0x17;
                          uVar15 = uVar29;
                        } while (iVar9 < (int)uVar14);
                      }
                      iVar9 = uVar29 + 7;
                      while (iVar9 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar75 = *pauVar20;
                            auVar46 = ZEXT3264(auVar75);
                            auVar58 = ZEXT3264(auVar75);
                            auVar68 = ZEXT3264(auVar75);
                            auVar76 = ZEXT3264(auVar75);
                            auVar79 = ZEXT3264(auVar75);
                            auVar89 = ZEXT3264(auVar75);
                            auVar96 = ZEXT3264(auVar75);
                            auVar98 = ZEXT3264(auVar75);
                          }
                        }
                        else {
                          auVar98 = ZEXT3264(*pauVar11);
                          auVar96 = ZEXT3264(pauVar11[1]);
                          auVar89 = ZEXT3264(pauVar11[2]);
                          auVar79 = ZEXT3264(pauVar11[3]);
                          auVar76 = ZEXT3264(pauVar11[4]);
                          auVar68 = ZEXT3264(pauVar11[5]);
                          auVar58 = ZEXT3264(pauVar11[6]);
                          auVar46 = ZEXT3264(pauVar11[7]);
                        }
                        auVar75 = auVar46._0_32_;
                        auVar152 = auVar58._0_32_;
                        auVar65 = auVar68._0_32_;
                        auVar56 = auVar76._0_32_;
                        auVar153 = auVar79._0_32_;
                        auVar84 = auVar89._0_32_;
                        auVar154 = auVar96._0_32_;
                        auVar92 = auVar98._0_32_;
                        if (0 < iVar38) {
                          lVar31 = 0;
                          iVar9 = iVar38;
                          do {
                            lVar37 = lVar31;
                            auVar75 = *(undefined1 (*) [32])(*pauVar26 + lVar37);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37);
                            auVar113._4_4_ = uVar19;
                            auVar113._0_4_ = uVar19;
                            auVar113._8_4_ = uVar19;
                            auVar113._12_4_ = uVar19;
                            auVar113._16_4_ = uVar19;
                            auVar113._20_4_ = uVar19;
                            auVar113._24_4_ = uVar19;
                            auVar113._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar98._0_32_,auVar75,auVar113);
                            auVar98 = ZEXT1664(auVar47);
                            auVar92 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 4);
                            auVar114._4_4_ = uVar19;
                            auVar114._0_4_ = uVar19;
                            auVar114._8_4_ = uVar19;
                            auVar114._12_4_ = uVar19;
                            auVar114._16_4_ = uVar19;
                            auVar114._20_4_ = uVar19;
                            auVar114._24_4_ = uVar19;
                            auVar114._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar96._0_32_,auVar75,auVar114);
                            auVar96 = ZEXT1664(auVar47);
                            auVar154 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 8);
                            auVar115._4_4_ = uVar19;
                            auVar115._0_4_ = uVar19;
                            auVar115._8_4_ = uVar19;
                            auVar115._12_4_ = uVar19;
                            auVar115._16_4_ = uVar19;
                            auVar115._20_4_ = uVar19;
                            auVar115._24_4_ = uVar19;
                            auVar115._28_4_ = uVar19;
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 0xc);
                            auVar124._4_4_ = uVar19;
                            auVar124._0_4_ = uVar19;
                            auVar124._8_4_ = uVar19;
                            auVar124._12_4_ = uVar19;
                            auVar124._16_4_ = uVar19;
                            auVar124._20_4_ = uVar19;
                            auVar124._24_4_ = uVar19;
                            auVar124._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar89._0_32_,auVar75,auVar115);
                            auVar89 = ZEXT1664(auVar47);
                            auVar84 = ZEXT1632(auVar47);
                            auVar47 = vfmadd231ps_fma(auVar79._0_32_,auVar75,auVar124);
                            auVar79 = ZEXT1664(auVar47);
                            auVar153 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(pauVar12[1] + lVar37);
                            auVar116._4_4_ = uVar19;
                            auVar116._0_4_ = uVar19;
                            auVar116._8_4_ = uVar19;
                            auVar116._12_4_ = uVar19;
                            auVar116._16_4_ = uVar19;
                            auVar116._20_4_ = uVar19;
                            auVar116._24_4_ = uVar19;
                            auVar116._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar76._0_32_,auVar75,auVar116);
                            auVar76 = ZEXT1664(auVar47);
                            auVar56 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(pauVar12[1] + lVar37 + 4);
                            auVar117._4_4_ = uVar19;
                            auVar117._0_4_ = uVar19;
                            auVar117._8_4_ = uVar19;
                            auVar117._12_4_ = uVar19;
                            auVar117._16_4_ = uVar19;
                            auVar117._20_4_ = uVar19;
                            auVar117._24_4_ = uVar19;
                            auVar117._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar68._0_32_,auVar75,auVar117);
                            auVar68 = ZEXT1664(auVar47);
                            auVar65 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(pauVar12[1] + lVar37 + 8);
                            auVar118._4_4_ = uVar19;
                            auVar118._0_4_ = uVar19;
                            auVar118._8_4_ = uVar19;
                            auVar118._12_4_ = uVar19;
                            auVar118._16_4_ = uVar19;
                            auVar118._20_4_ = uVar19;
                            auVar118._24_4_ = uVar19;
                            auVar118._28_4_ = uVar19;
                            uVar19 = *(undefined4 *)(pauVar12[1] + lVar37 + 0xc);
                            auVar125._4_4_ = uVar19;
                            auVar125._0_4_ = uVar19;
                            auVar125._8_4_ = uVar19;
                            auVar125._12_4_ = uVar19;
                            auVar125._16_4_ = uVar19;
                            auVar125._20_4_ = uVar19;
                            auVar125._24_4_ = uVar19;
                            auVar125._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar58._0_32_,auVar75,auVar118);
                            auVar58 = ZEXT1664(auVar47);
                            auVar152 = ZEXT1632(auVar47);
                            auVar47 = vfmadd231ps_fma(auVar46._0_32_,auVar75,auVar125);
                            auVar46 = ZEXT1664(auVar47);
                            auVar75 = ZEXT1632(auVar47);
                            iVar9 = iVar9 + -1;
                            lVar31 = lVar37 + 0x20;
                          } while (iVar9 != 0);
                          pauVar12 = (undefined1 (*) [16])(pauVar12[2] + lVar37);
                        }
                        if (iVar8 < iVar23) {
                          *pauVar11 = auVar92;
                          pauVar11[1] = auVar154;
                          pauVar11[2] = auVar84;
                          pauVar11[3] = auVar153;
                          pauVar11[4] = auVar56;
                          pauVar11[5] = auVar65;
                          pauVar11[6] = auVar152;
                          pauVar11[7] = auVar75;
                        }
                        else {
                          if (iVar36 == 8) {
                            *pauVar18 = auVar92;
                            pauVar18[1] = auVar154;
                            pauVar18[2] = auVar84;
                            pauVar18[3] = auVar153;
                            pauVar18[4] = auVar56;
                            pauVar18[5] = auVar65;
                            pauVar18[6] = auVar152;
                            pauVar18[7] = auVar75;
                            pauVar18 = pauVar18 + 8;
                          }
                          if (iVar36 == 4) {
                            auVar99._16_16_ = auVar154._0_16_;
                            auVar99._0_16_ = auVar92._0_16_;
                            auVar119._16_16_ = auVar153._0_16_;
                            auVar119._0_16_ = auVar84._0_16_;
                            auVar126._16_16_ = auVar65._0_16_;
                            auVar126._0_16_ = auVar56._0_16_;
                            auVar131._16_16_ = auVar75._0_16_;
                            auVar131._0_16_ = auVar152._0_16_;
                            auVar111 = vperm2f128_avx(auVar92,auVar154,0x31);
                            auVar97 = vperm2f128_avx(auVar84,auVar153,0x31);
                            auVar134 = vperm2f128_avx(auVar56,auVar65,0x31);
                            auVar93 = vperm2f128_avx(auVar152,auVar75,0x31);
                            *pauVar18 = auVar99;
                            pauVar18[1] = auVar119;
                            pauVar18[2] = auVar126;
                            pauVar18[3] = auVar131;
                            *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar111;
                            *(undefined1 (*) [32])(pauVar18[1] + lVar35 * 4) = auVar97;
                            *(undefined1 (*) [32])(pauVar18[2] + lVar35 * 4) = auVar134;
                            *(undefined1 (*) [32])(pauVar18[3] + lVar35 * 4) = auVar93;
                            pauVar18 = pauVar18 + 4;
                          }
                          if (iVar36 == 1) {
                            auVar111 = vunpcklps_avx(auVar92,auVar154);
                            auVar154 = vunpckhps_avx(auVar92,auVar154);
                            auVar97 = vunpcklps_avx(auVar84,auVar153);
                            auVar153 = vunpckhps_avx(auVar84,auVar153);
                            auVar134 = vunpcklps_avx(auVar56,auVar65);
                            auVar56 = vunpckhps_avx(auVar56,auVar65);
                            auVar65 = vunpcklps_avx(auVar152,auVar75);
                            auVar84 = vunpckhps_avx(auVar152,auVar75);
                            auVar92 = vunpcklpd_avx(auVar111,auVar97);
                            auVar75 = vunpckhpd_avx(auVar111,auVar97);
                            auVar111 = vunpcklpd_avx(auVar154,auVar153);
                            auVar152 = vunpckhpd_avx(auVar154,auVar153);
                            auVar153 = vunpcklpd_avx(auVar134,auVar65);
                            auVar65 = vunpckhpd_avx(auVar134,auVar65);
                            auVar154 = vunpcklpd_avx(auVar56,auVar84);
                            auVar56 = vunpckhpd_avx(auVar56,auVar84);
                            auVar66._16_16_ = auVar153._0_16_;
                            auVar66._0_16_ = auVar92._0_16_;
                            auVar120._16_16_ = auVar65._0_16_;
                            auVar120._0_16_ = auVar75._0_16_;
                            auVar127._16_16_ = auVar154._0_16_;
                            auVar127._0_16_ = auVar111._0_16_;
                            auVar132._16_16_ = auVar56._0_16_;
                            auVar132._0_16_ = auVar152._0_16_;
                            auVar153 = vperm2f128_avx(auVar92,auVar153,0x31);
                            auVar75 = vperm2f128_avx(auVar75,auVar65,0x31);
                            auVar65 = vperm2f128_avx(auVar111,auVar154,0x31);
                            auVar152 = vperm2f128_avx(auVar152,auVar56,0x31);
                            *pauVar18 = auVar66;
                            *(undefined1 (*) [32])(*pauVar18 + lVar10 * 4) = auVar120;
                            *(undefined1 (*) [32])(*pauVar18 + lVar27 * 4) = auVar127;
                            *(undefined1 (*) [32])(*pauVar18 + local_1d0 * 4) = auVar132;
                            *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar153;
                            *(undefined1 (*) [32])(*pauVar18 + local_1d8 * 4) = auVar75;
                            *(undefined1 (*) [32])(*pauVar18 + local_1e0 * 4) = auVar65;
                            *(undefined1 (*) [32])(*pauVar18 + local_168 * 4) = auVar152;
                            pauVar18 = pauVar18 + 1;
                          }
                        }
                        pauVar11 = pauVar11 + 8;
                        iVar9 = uVar29 + 0xf;
                        uVar29 = uVar29 + 8;
                      }
                      uVar15 = uVar29 | 3;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar75 = *pauVar20;
                            auVar46 = ZEXT3264(auVar75);
                            auVar58 = ZEXT3264(auVar75);
                            auVar68 = ZEXT3264(auVar75);
                            auVar76 = ZEXT3264(auVar75);
                          }
                        }
                        else {
                          auVar76 = ZEXT3264(*pauVar11);
                          auVar68 = ZEXT3264(pauVar11[1]);
                          auVar58 = ZEXT3264(pauVar11[2]);
                          auVar46 = ZEXT3264(pauVar11[3]);
                        }
                        auVar75 = auVar46._0_32_;
                        auVar152 = auVar58._0_32_;
                        auVar65 = auVar68._0_32_;
                        auVar56 = auVar76._0_32_;
                        if (0 < iVar38) {
                          lVar31 = 0;
                          iVar9 = iVar38;
                          do {
                            lVar37 = lVar31;
                            auVar75 = *(undefined1 (*) [32])(*pauVar26 + lVar37 * 2);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37);
                            auVar85._4_4_ = uVar19;
                            auVar85._0_4_ = uVar19;
                            auVar85._8_4_ = uVar19;
                            auVar85._12_4_ = uVar19;
                            auVar85._16_4_ = uVar19;
                            auVar85._20_4_ = uVar19;
                            auVar85._24_4_ = uVar19;
                            auVar85._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar76._0_32_,auVar75,auVar85);
                            auVar76 = ZEXT1664(auVar47);
                            auVar56 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 4);
                            auVar86._4_4_ = uVar19;
                            auVar86._0_4_ = uVar19;
                            auVar86._8_4_ = uVar19;
                            auVar86._12_4_ = uVar19;
                            auVar86._16_4_ = uVar19;
                            auVar86._20_4_ = uVar19;
                            auVar86._24_4_ = uVar19;
                            auVar86._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar68._0_32_,auVar75,auVar86);
                            auVar68 = ZEXT1664(auVar47);
                            auVar65 = ZEXT1632(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 8);
                            auVar87._4_4_ = uVar19;
                            auVar87._0_4_ = uVar19;
                            auVar87._8_4_ = uVar19;
                            auVar87._12_4_ = uVar19;
                            auVar87._16_4_ = uVar19;
                            auVar87._20_4_ = uVar19;
                            auVar87._24_4_ = uVar19;
                            auVar87._28_4_ = uVar19;
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar37 + 0xc);
                            auVar95._4_4_ = uVar19;
                            auVar95._0_4_ = uVar19;
                            auVar95._8_4_ = uVar19;
                            auVar95._12_4_ = uVar19;
                            auVar95._16_4_ = uVar19;
                            auVar95._20_4_ = uVar19;
                            auVar95._24_4_ = uVar19;
                            auVar95._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar58._0_32_,auVar75,auVar87);
                            auVar58 = ZEXT1664(auVar47);
                            auVar152 = ZEXT1632(auVar47);
                            auVar47 = vfmadd231ps_fma(auVar46._0_32_,auVar75,auVar95);
                            auVar46 = ZEXT1664(auVar47);
                            auVar75 = ZEXT1632(auVar47);
                            iVar9 = iVar9 + -1;
                            lVar31 = lVar37 + 0x10;
                          } while (iVar9 != 0);
                          pauVar12 = (undefined1 (*) [16])(pauVar12[1] + lVar37);
                        }
                        if (iVar8 < iVar23) {
                          *pauVar11 = auVar56;
                          pauVar11[1] = auVar65;
                          pauVar11[2] = auVar152;
                          pauVar11[3] = auVar75;
                        }
                        else {
                          if (iVar36 == 8) {
                            *pauVar18 = auVar56;
                            pauVar18[1] = auVar65;
                            pauVar18[2] = auVar152;
                            pauVar18[3] = auVar75;
                            pauVar18 = pauVar18 + 4;
                          }
                          auVar48 = auVar56._0_16_;
                          auVar59 = auVar65._0_16_;
                          auVar49 = auVar152._0_16_;
                          auVar47 = auVar75._0_16_;
                          if (iVar36 == 4) {
                            auVar77._16_16_ = auVar59;
                            auVar77._0_16_ = auVar48;
                            auVar88._16_16_ = auVar47;
                            auVar88._0_16_ = auVar49;
                            auVar153 = vperm2f128_avx(auVar56,auVar65,0x31);
                            auVar84 = vperm2f128_avx(auVar152,auVar75,0x31);
                            *pauVar18 = auVar77;
                            pauVar18[1] = auVar88;
                            *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar153;
                            *(undefined1 (*) [32])(pauVar18[1] + lVar35 * 4) = auVar84;
                            pauVar18 = pauVar18 + 2;
                          }
                          if (iVar36 == 1) {
                            auVar55 = vunpcklps_avx(auVar48,auVar59);
                            auVar141 = vunpcklps_avx(auVar49,auVar47);
                            auVar59 = vunpckhps_avx(auVar48,auVar59);
                            auVar48 = vunpckhps_avx(auVar49,auVar47);
                            auVar47 = vmovlhps_avx(auVar55,auVar141);
                            auVar55 = vunpckhpd_avx(auVar55,auVar141);
                            auVar49 = vmovlhps_avx(auVar59,auVar48);
                            auVar141 = vunpckhpd_avx(auVar59,auVar48);
                            auVar48 = vunpcklps_avx(auVar56._16_16_,auVar65._16_16_);
                            auVar142 = vunpcklps_avx(auVar152._16_16_,auVar75._16_16_);
                            auVar143 = vunpckhps_avx(auVar56._16_16_,auVar65._16_16_);
                            auVar144 = vunpckhps_avx(auVar152._16_16_,auVar75._16_16_);
                            auVar59 = vmovlhps_avx(auVar48,auVar142);
                            auVar142 = vunpckhpd_avx(auVar48,auVar142);
                            auVar48 = vmovlhps_avx(auVar143,auVar144);
                            auVar143 = vunpckhpd_avx(auVar143,auVar144);
                            *(undefined1 (*) [16])*pauVar18 = auVar47;
                            *(undefined1 (*) [16])(*pauVar18 + lVar10 * 4) = auVar55;
                            *(undefined1 (*) [16])(*pauVar18 + lVar27 * 4) = auVar49;
                            *(undefined1 (*) [16])(*pauVar18 + local_1d0 * 4) = auVar141;
                            *(undefined1 (*) [16])(*pauVar18 + lVar35 * 4) = auVar59;
                            *(undefined1 (*) [16])(*pauVar18 + local_1d8 * 4) = auVar142;
                            *(undefined1 (*) [16])(*pauVar18 + local_1e0 * 4) = auVar48;
                            *(undefined1 (*) [16])(*pauVar18 + local_168 * 4) = auVar143;
                            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                          }
                        }
                        pauVar11 = pauVar11 + 4;
                        uVar15 = uVar29 + 7;
                        uVar29 = uVar29 + 4;
                      }
                      uVar15 = uVar29 | 1;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar46 = ZEXT3264(*pauVar20);
                            auVar58 = ZEXT3264(*pauVar20);
                          }
                        }
                        else {
                          auVar58 = ZEXT3264(*pauVar11);
                          auVar46 = ZEXT3264(pauVar11[1]);
                        }
                        auVar75 = auVar46._0_32_;
                        auVar152 = auVar58._0_32_;
                        if (0 < iVar38) {
                          lVar31 = 0;
                          iVar9 = iVar38;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar31);
                            auVar75._4_4_ = uVar19;
                            auVar75._0_4_ = uVar19;
                            auVar75._8_4_ = uVar19;
                            auVar75._12_4_ = uVar19;
                            auVar75._16_4_ = uVar19;
                            auVar75._20_4_ = uVar19;
                            auVar75._24_4_ = uVar19;
                            auVar75._28_4_ = uVar19;
                            uVar19 = *(undefined4 *)(*pauVar12 + lVar31 + 4);
                            auVar78._4_4_ = uVar19;
                            auVar78._0_4_ = uVar19;
                            auVar78._8_4_ = uVar19;
                            auVar78._12_4_ = uVar19;
                            auVar78._16_4_ = uVar19;
                            auVar78._20_4_ = uVar19;
                            auVar78._24_4_ = uVar19;
                            auVar78._28_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar58._0_32_,
                                                      *(undefined1 (*) [32])(*pauVar26 + lVar31 * 4)
                                                      ,auVar75);
                            auVar58 = ZEXT1664(auVar47);
                            auVar152 = ZEXT1632(auVar47);
                            auVar47 = vfmadd231ps_fma(auVar46._0_32_,
                                                      *(undefined1 (*) [32])(*pauVar26 + lVar31 * 4)
                                                      ,auVar78);
                            auVar46 = ZEXT1664(auVar47);
                            auVar75 = ZEXT1632(auVar47);
                            lVar31 = lVar31 + 8;
                            iVar9 = iVar9 + -1;
                          } while (iVar9 != 0);
                          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar31);
                        }
                        if (iVar8 < iVar23) {
                          *pauVar11 = auVar152;
                          pauVar11[1] = auVar75;
                        }
                        else {
                          if (iVar36 == 8) {
                            *pauVar18 = auVar152;
                            pauVar18[1] = auVar75;
                            pauVar18 = pauVar18 + 2;
                          }
                          auVar49 = auVar152._0_16_;
                          auVar59 = auVar152._16_16_;
                          auVar47 = auVar75._0_16_;
                          if (iVar36 == 4) {
                            auVar67._16_16_ = auVar47;
                            auVar67._0_16_ = auVar49;
                            auVar65 = vperm2f128_avx(auVar152,auVar75,0x31);
                            *pauVar18 = auVar67;
                            *(undefined1 (*) [32])(*pauVar18 + lVar35 * 4) = auVar65;
                            pauVar18 = pauVar18 + 1;
                          }
                          if (iVar36 == 1) {
                            *(int *)*pauVar18 = auVar152._0_4_;
                            uVar19 = vextractps_avx(auVar49,1);
                            *(undefined4 *)(*pauVar18 + lVar10 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar49,2);
                            *(undefined4 *)(*pauVar18 + lVar27 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar49,3);
                            *(undefined4 *)(*pauVar18 + local_80 * 4) = uVar19;
                            *(int *)(*pauVar18 + lVar35 * 4) = auVar152._16_4_;
                            uVar19 = vextractps_avx(auVar59,1);
                            *(undefined4 *)(*pauVar18 + local_88 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar59,2);
                            *(undefined4 *)(*pauVar18 + local_90 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar59,3);
                            *(undefined4 *)(*pauVar18 + local_98 * 4) = uVar19;
                            *(int *)(*pauVar18 + 4) = auVar75._0_4_;
                            uVar19 = vextractps_avx(auVar47,1);
                            *(undefined4 *)(*pauVar18 + local_f8 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,2);
                            *(undefined4 *)(*pauVar18 + local_b0 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,3);
                            *(undefined4 *)(*pauVar18 + local_b8 * 4) = uVar19;
                            auVar47 = auVar75._16_16_;
                            *(int *)(*pauVar18 + local_c0 * 4) = auVar75._16_4_;
                            uVar19 = vextractps_avx(auVar47,1);
                            *(undefined4 *)(*pauVar18 + local_c8 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,2);
                            *(undefined4 *)(*pauVar18 + local_d0 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,3);
                            *(undefined4 *)(*pauVar18 + local_d8 * 4) = uVar19;
                            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 8);
                          }
                        }
                        pauVar11 = pauVar11 + 2;
                        uVar15 = uVar29 + 3;
                        uVar29 = uVar29 + 2;
                      }
                      if ((int)uVar29 < (int)uVar14) {
                        do {
                          if (iVar22 == 0) {
                            if (pauVar20 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar46 = ZEXT3264(*pauVar20);
                            }
                          }
                          else {
                            auVar46 = ZEXT3264(*pauVar11);
                          }
                          auVar75 = auVar46._0_32_;
                          if (0 < iVar38) {
                            lVar31 = 0;
                            iVar9 = iVar38;
                            do {
                              uVar19 = *(undefined4 *)(*pauVar12 + lVar31);
                              auVar57._4_4_ = uVar19;
                              auVar57._0_4_ = uVar19;
                              auVar57._8_4_ = uVar19;
                              auVar57._12_4_ = uVar19;
                              auVar57._16_4_ = uVar19;
                              auVar57._20_4_ = uVar19;
                              auVar57._24_4_ = uVar19;
                              auVar57._28_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar46._0_32_,auVar57,
                                                        *(undefined1 (*) [32])
                                                         (*pauVar26 + lVar31 * 8));
                              auVar46 = ZEXT1664(auVar47);
                              auVar75 = ZEXT1632(auVar47);
                              lVar31 = lVar31 + 4;
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar31);
                          }
                          if (iVar8 < iVar23) {
                            *pauVar11 = auVar75;
                          }
                          else {
                            if (iVar36 == 8) {
                              *pauVar18 = auVar75;
                              pauVar18 = pauVar18 + 1;
                            }
                            auVar49 = auVar75._16_16_;
                            auVar47 = auVar75._0_16_;
                            if (iVar36 == 4) {
                              *(undefined1 (*) [16])*pauVar18 = auVar47;
                              *(undefined1 (*) [16])(*pauVar18 + lVar35 * 4) = auVar49;
                              pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                            }
                            if (iVar36 == 1) {
                              *(int *)*pauVar18 = auVar75._0_4_;
                              uVar19 = vextractps_avx(auVar47,1);
                              *(undefined4 *)(*pauVar18 + lVar10 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar47,2);
                              *(undefined4 *)(*pauVar18 + lVar27 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar47,3);
                              *(undefined4 *)(*pauVar18 + local_1d0 * 4) = uVar19;
                              *(int *)(*pauVar18 + lVar35 * 4) = auVar75._16_4_;
                              uVar19 = vextractps_avx(auVar49,1);
                              *(undefined4 *)(*pauVar18 + local_1d8 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar49,2);
                              *(undefined4 *)(*pauVar18 + local_1e0 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar49,3);
                              *(undefined4 *)(*pauVar18 + local_168 * 4) = uVar19;
                              pauVar18 = (undefined1 (*) [32])(*pauVar18 + 4);
                            }
                          }
                          pauVar11 = pauVar11 + 1;
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar14);
                      }
                      pauVar26 = (undefined1 (*) [32])(*pauVar26 + local_48);
                      uVar16 = local_38 + 8;
                    } while (local_38 + 0xf < local_50);
                  }
                  if ((int)((uint)uVar16 | 3) < (int)local_1c4) {
                    local_168 = (long)(iVar36 * iVar7);
                    lVar10 = (long)iVar24;
                    lVar27 = (long)(iVar24 * 2);
                    lVar35 = (long)(local_a0 * 0x300000000) >> 0x20;
                    local_1d0 = (ulong)(iVar24 * 2 + 1);
                    local_1d8 = (long)(iVar24 * 3 + 1);
                    local_f8 = (long)(iVar38 * 4) * 4;
                    uVar16 = uVar16 & 0xffffffff;
                    pauVar18 = pauVar20;
                    do {
                      local_1e0 = uVar16;
                      pauVar20 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 local_1e0 * 4 + local_108 * 4);
                      if (pauVar18 == (undefined1 (*) [32])0x0) {
                        pauVar20 = pauVar18;
                      }
                      uVar29 = 0;
                      pauVar12 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_168 * 4 + (local_1e0 + local_108) * lVar10 * 4);
                      pauVar32 = local_1c0;
                      if (0xb < (int)uVar14) {
                        uVar15 = 0;
                        do {
                          if (iVar22 == 0) {
                            if (pauVar20 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar47 = *(undefined1 (*) [16])*pauVar20;
                              auVar46 = ZEXT1664(auVar47);
                              auVar58 = ZEXT1664(auVar47);
                              auVar68 = ZEXT1664(auVar47);
                              auVar76 = ZEXT1664(auVar47);
                              auVar79 = ZEXT1664(auVar47);
                              auVar89 = ZEXT1664(auVar47);
                              auVar96 = ZEXT1664(auVar47);
                              auVar98 = ZEXT1664(auVar47);
                              auVar100 = ZEXT1664(auVar47);
                              auVar121 = ZEXT1664(auVar47);
                              auVar128 = ZEXT1664(auVar47);
                              auVar133 = ZEXT1664(auVar47);
                            }
                          }
                          else {
                            auVar133 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                            auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                            auVar121 = ZEXT1664(*(undefined1 (*) [16])pauVar11[1]);
                            auVar100 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[1] + 0x10));
                            auVar98 = ZEXT1664(*(undefined1 (*) [16])pauVar11[2]);
                            auVar96 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[2] + 0x10));
                            auVar89 = ZEXT1664(*(undefined1 (*) [16])pauVar11[3]);
                            auVar79 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[3] + 0x10));
                            auVar76 = ZEXT1664(*(undefined1 (*) [16])pauVar11[4]);
                            auVar68 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[4] + 0x10));
                            auVar58 = ZEXT1664(*(undefined1 (*) [16])pauVar11[5]);
                            auVar46 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[5] + 0x10));
                          }
                          auVar101 = auVar46._0_16_;
                          auVar146 = auVar58._0_16_;
                          auVar145 = auVar68._0_16_;
                          auVar144 = auVar76._0_16_;
                          auVar143 = auVar79._0_16_;
                          auVar142 = auVar89._0_16_;
                          auVar141 = auVar96._0_16_;
                          auVar55 = auVar98._0_16_;
                          auVar48 = auVar100._0_16_;
                          auVar59 = auVar121._0_16_;
                          auVar49 = auVar128._0_16_;
                          auVar47 = auVar133._0_16_;
                          pauVar18 = pauVar26;
                          iVar9 = iVar38;
                          if (0 < iVar38) {
                            do {
                              auVar101 = *(undefined1 (*) [16])*pauVar18;
                              uVar19 = *(undefined4 *)*pauVar32;
                              auVar47._4_4_ = uVar19;
                              auVar47._0_4_ = uVar19;
                              auVar47._8_4_ = uVar19;
                              auVar47._12_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar133._0_16_,auVar101,auVar47);
                              auVar133 = ZEXT1664(auVar47);
                              uVar19 = *(undefined4 *)(*pauVar32 + 4);
                              auVar141._4_4_ = uVar19;
                              auVar141._0_4_ = uVar19;
                              auVar141._8_4_ = uVar19;
                              auVar141._12_4_ = uVar19;
                              auVar49 = vfmadd231ps_fma(auVar128._0_16_,auVar101,auVar141);
                              auVar128 = ZEXT1664(auVar49);
                              uVar19 = *(undefined4 *)(*pauVar32 + 8);
                              auVar142._4_4_ = uVar19;
                              auVar142._0_4_ = uVar19;
                              auVar142._8_4_ = uVar19;
                              auVar142._12_4_ = uVar19;
                              auVar59 = vfmadd231ps_fma(auVar121._0_16_,auVar101,auVar142);
                              auVar121 = ZEXT1664(auVar59);
                              uVar19 = *(undefined4 *)(*pauVar32 + 0xc);
                              auVar143._4_4_ = uVar19;
                              auVar143._0_4_ = uVar19;
                              auVar143._8_4_ = uVar19;
                              auVar143._12_4_ = uVar19;
                              auVar48 = vfmadd231ps_fma(auVar100._0_16_,auVar101,auVar143);
                              auVar100 = ZEXT1664(auVar48);
                              uVar19 = *(undefined4 *)pauVar32[1];
                              auVar144._4_4_ = uVar19;
                              auVar144._0_4_ = uVar19;
                              auVar144._8_4_ = uVar19;
                              auVar144._12_4_ = uVar19;
                              auVar55 = vfmadd231ps_fma(auVar98._0_16_,auVar101,auVar144);
                              auVar98 = ZEXT1664(auVar55);
                              uVar19 = *(undefined4 *)(pauVar32[1] + 4);
                              auVar145._4_4_ = uVar19;
                              auVar145._0_4_ = uVar19;
                              auVar145._8_4_ = uVar19;
                              auVar145._12_4_ = uVar19;
                              auVar141 = vfmadd231ps_fma(auVar96._0_16_,auVar101,auVar145);
                              auVar96 = ZEXT1664(auVar141);
                              uVar19 = *(undefined4 *)(pauVar32[1] + 8);
                              auVar146._4_4_ = uVar19;
                              auVar146._0_4_ = uVar19;
                              auVar146._8_4_ = uVar19;
                              auVar146._12_4_ = uVar19;
                              auVar142 = vfmadd231ps_fma(auVar89._0_16_,auVar101,auVar146);
                              auVar89 = ZEXT1664(auVar142);
                              uVar19 = *(undefined4 *)(pauVar32[1] + 0xc);
                              auVar147._4_4_ = uVar19;
                              auVar147._0_4_ = uVar19;
                              auVar147._8_4_ = uVar19;
                              auVar147._12_4_ = uVar19;
                              auVar143 = vfmadd231ps_fma(auVar79._0_16_,auVar101,auVar147);
                              auVar79 = ZEXT1664(auVar143);
                              uVar19 = *(undefined4 *)pauVar32[2];
                              auVar148._4_4_ = uVar19;
                              auVar148._0_4_ = uVar19;
                              auVar148._8_4_ = uVar19;
                              auVar148._12_4_ = uVar19;
                              auVar144 = vfmadd231ps_fma(auVar76._0_16_,auVar101,auVar148);
                              auVar76 = ZEXT1664(auVar144);
                              uVar19 = *(undefined4 *)(pauVar32[2] + 4);
                              auVar149._4_4_ = uVar19;
                              auVar149._0_4_ = uVar19;
                              auVar149._8_4_ = uVar19;
                              auVar149._12_4_ = uVar19;
                              auVar145 = vfmadd231ps_fma(auVar68._0_16_,auVar101,auVar149);
                              auVar68 = ZEXT1664(auVar145);
                              uVar19 = *(undefined4 *)(pauVar32[2] + 8);
                              auVar150._4_4_ = uVar19;
                              auVar150._0_4_ = uVar19;
                              auVar150._8_4_ = uVar19;
                              auVar150._12_4_ = uVar19;
                              auVar146 = vfmadd231ps_fma(auVar58._0_16_,auVar101,auVar150);
                              auVar58 = ZEXT1664(auVar146);
                              uVar19 = *(undefined4 *)(pauVar32[2] + 0xc);
                              auVar151._4_4_ = uVar19;
                              auVar151._0_4_ = uVar19;
                              auVar151._8_4_ = uVar19;
                              auVar151._12_4_ = uVar19;
                              auVar101 = vfmadd231ps_fma(auVar46._0_16_,auVar101,auVar151);
                              auVar46 = ZEXT1664(auVar101);
                              pauVar32 = pauVar32 + 3;
                              iVar9 = iVar9 + -1;
                              pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                            } while (iVar9 != 0);
                          }
                          if (iVar8 < iVar23) {
                            *(undefined1 (*) [16])*pauVar11 = auVar47;
                            *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                            *(undefined1 (*) [16])pauVar11[1] = auVar59;
                            *(undefined1 (*) [16])(pauVar11[1] + 0x10) = auVar48;
                            *(undefined1 (*) [16])pauVar11[2] = auVar55;
                            *(undefined1 (*) [16])(pauVar11[2] + 0x10) = auVar141;
                            *(undefined1 (*) [16])pauVar11[3] = auVar142;
                            *(undefined1 (*) [16])(pauVar11[3] + 0x10) = auVar143;
                            *(undefined1 (*) [16])pauVar11[4] = auVar144;
                            *(undefined1 (*) [16])(pauVar11[4] + 0x10) = auVar145;
                            *(undefined1 (*) [16])pauVar11[5] = auVar146;
                            *(undefined1 (*) [16])(pauVar11[5] + 0x10) = auVar101;
                          }
                          else {
                            if (iVar36 == 4) {
                              *pauVar12 = auVar47;
                              pauVar12[1] = auVar49;
                              pauVar12[2] = auVar59;
                              pauVar12[3] = auVar48;
                              pauVar12[4] = auVar55;
                              pauVar12[5] = auVar141;
                              pauVar12[6] = auVar142;
                              pauVar12[7] = auVar143;
                              pauVar12[8] = auVar144;
                              pauVar12[9] = auVar145;
                              pauVar12[10] = auVar146;
                              pauVar12[0xb] = auVar101;
                              pauVar12 = pauVar12 + 0xc;
                            }
                            if (iVar36 == 1) {
                              auVar147 = vunpcklps_avx(auVar47,auVar49);
                              auVar149 = vunpcklps_avx(auVar59,auVar48);
                              auVar148 = vunpckhps_avx(auVar47,auVar49);
                              auVar59 = vunpckhps_avx(auVar59,auVar48);
                              auVar47 = vmovlhps_avx(auVar147,auVar149);
                              auVar147 = vunpckhpd_avx(auVar147,auVar149);
                              auVar49 = vmovlhps_avx(auVar148,auVar59);
                              auVar148 = vunpckhpd_avx(auVar148,auVar59);
                              auVar48 = vunpcklps_avx(auVar55,auVar141);
                              auVar149 = vunpcklps_avx(auVar142,auVar143);
                              auVar55 = vunpckhps_avx(auVar55,auVar141);
                              auVar141 = vunpckhps_avx(auVar142,auVar143);
                              auVar59 = vmovlhps_avx(auVar48,auVar149);
                              auVar142 = vunpckhpd_avx(auVar48,auVar149);
                              auVar48 = vmovlhps_avx(auVar55,auVar141);
                              auVar143 = vunpckhpd_avx(auVar55,auVar141);
                              auVar141 = vunpcklps_avx(auVar144,auVar145);
                              auVar149 = vunpcklps_avx(auVar146,auVar101);
                              auVar145 = vunpckhps_avx(auVar144,auVar145);
                              auVar146 = vunpckhps_avx(auVar146,auVar101);
                              auVar55 = vmovlhps_avx(auVar141,auVar149);
                              auVar144 = vunpckhpd_avx(auVar141,auVar149);
                              auVar141 = vmovlhps_avx(auVar145,auVar146);
                              auVar145 = vunpckhpd_avx(auVar145,auVar146);
                              *pauVar12 = auVar47;
                              *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar147;
                              *(undefined1 (*) [16])(*pauVar12 + lVar27 * 4) = auVar49;
                              *(undefined1 (*) [16])(*pauVar12 + lVar35 * 4) = auVar148;
                              pauVar12[1] = auVar59;
                              *(undefined1 (*) [16])(pauVar12[1] + lVar10 * 4) = auVar142;
                              *(undefined1 (*) [16])(pauVar12[1] + lVar27 * 4) = auVar48;
                              *(undefined1 (*) [16])(pauVar12[1] + lVar35 * 4) = auVar143;
                              pauVar12[2] = auVar55;
                              *(undefined1 (*) [16])(pauVar12[2] + lVar10 * 4) = auVar144;
                              *(undefined1 (*) [16])(pauVar12[2] + lVar27 * 4) = auVar141;
                              *(undefined1 (*) [16])(pauVar12[2] + lVar35 * 4) = auVar145;
                              pauVar12 = pauVar12 + 3;
                            }
                          }
                          pauVar11 = pauVar11 + 6;
                          uVar29 = uVar15 + 0xc;
                          iVar9 = uVar15 + 0x17;
                          uVar15 = uVar29;
                        } while (iVar9 < (int)uVar14);
                      }
                      iVar9 = uVar29 + 7;
                      while (iVar9 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar47 = *(undefined1 (*) [16])*pauVar20;
                            auVar46 = ZEXT1664(auVar47);
                            auVar58 = ZEXT1664(auVar47);
                            auVar68 = ZEXT1664(auVar47);
                            auVar76 = ZEXT1664(auVar47);
                            auVar79 = ZEXT1664(auVar47);
                            auVar89 = ZEXT1664(auVar47);
                            auVar96 = ZEXT1664(auVar47);
                            auVar98 = ZEXT1664(auVar47);
                          }
                        }
                        else {
                          auVar98 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                          auVar96 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                          auVar89 = ZEXT1664(*(undefined1 (*) [16])pauVar11[1]);
                          auVar79 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[1] + 0x10));
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])pauVar11[2]);
                          auVar58 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[2] + 0x10));
                          auVar68 = ZEXT1664(*(undefined1 (*) [16])pauVar11[3]);
                          auVar76 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[3] + 0x10));
                        }
                        auVar143 = auVar76._0_16_;
                        auVar142 = auVar68._0_16_;
                        auVar141 = auVar58._0_16_;
                        auVar55 = auVar46._0_16_;
                        auVar48 = auVar79._0_16_;
                        auVar59 = auVar89._0_16_;
                        auVar49 = auVar96._0_16_;
                        auVar47 = auVar98._0_16_;
                        pauVar18 = pauVar26;
                        iVar9 = iVar38;
                        if (0 < iVar38) {
                          do {
                            auVar143 = *(undefined1 (*) [16])*pauVar18;
                            uVar19 = *(undefined4 *)*pauVar32;
                            auVar101._4_4_ = uVar19;
                            auVar101._0_4_ = uVar19;
                            auVar101._8_4_ = uVar19;
                            auVar101._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar98._0_16_,auVar143,auVar101);
                            auVar98 = ZEXT1664(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar32 + 4);
                            auVar102._4_4_ = uVar19;
                            auVar102._0_4_ = uVar19;
                            auVar102._8_4_ = uVar19;
                            auVar102._12_4_ = uVar19;
                            auVar49 = vfmadd231ps_fma(auVar96._0_16_,auVar143,auVar102);
                            auVar96 = ZEXT1664(auVar49);
                            uVar19 = *(undefined4 *)(*pauVar32 + 8);
                            auVar103._4_4_ = uVar19;
                            auVar103._0_4_ = uVar19;
                            auVar103._8_4_ = uVar19;
                            auVar103._12_4_ = uVar19;
                            auVar59 = vfmadd231ps_fma(auVar89._0_16_,auVar143,auVar103);
                            auVar89 = ZEXT1664(auVar59);
                            uVar19 = *(undefined4 *)(*pauVar32 + 0xc);
                            auVar104._4_4_ = uVar19;
                            auVar104._0_4_ = uVar19;
                            auVar104._8_4_ = uVar19;
                            auVar104._12_4_ = uVar19;
                            auVar48 = vfmadd231ps_fma(auVar79._0_16_,auVar143,auVar104);
                            auVar79 = ZEXT1664(auVar48);
                            uVar19 = *(undefined4 *)pauVar32[1];
                            auVar105._4_4_ = uVar19;
                            auVar105._0_4_ = uVar19;
                            auVar105._8_4_ = uVar19;
                            auVar105._12_4_ = uVar19;
                            auVar55 = vfmadd231ps_fma(auVar46._0_16_,auVar143,auVar105);
                            auVar46 = ZEXT1664(auVar55);
                            uVar19 = *(undefined4 *)(pauVar32[1] + 4);
                            auVar106._4_4_ = uVar19;
                            auVar106._0_4_ = uVar19;
                            auVar106._8_4_ = uVar19;
                            auVar106._12_4_ = uVar19;
                            auVar141 = vfmadd231ps_fma(auVar58._0_16_,auVar143,auVar106);
                            auVar58 = ZEXT1664(auVar141);
                            uVar19 = *(undefined4 *)(pauVar32[1] + 8);
                            auVar107._4_4_ = uVar19;
                            auVar107._0_4_ = uVar19;
                            auVar107._8_4_ = uVar19;
                            auVar107._12_4_ = uVar19;
                            auVar142 = vfmadd231ps_fma(auVar68._0_16_,auVar143,auVar107);
                            auVar68 = ZEXT1664(auVar142);
                            uVar19 = *(undefined4 *)(pauVar32[1] + 0xc);
                            auVar108._4_4_ = uVar19;
                            auVar108._0_4_ = uVar19;
                            auVar108._8_4_ = uVar19;
                            auVar108._12_4_ = uVar19;
                            auVar143 = vfmadd231ps_fma(auVar76._0_16_,auVar143,auVar108);
                            auVar76 = ZEXT1664(auVar143);
                            pauVar32 = pauVar32 + 2;
                            iVar9 = iVar9 + -1;
                            pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                          } while (iVar9 != 0);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                          *(undefined1 (*) [16])pauVar11[1] = auVar59;
                          *(undefined1 (*) [16])(pauVar11[1] + 0x10) = auVar48;
                          *(undefined1 (*) [16])pauVar11[2] = auVar55;
                          *(undefined1 (*) [16])(pauVar11[2] + 0x10) = auVar141;
                          *(undefined1 (*) [16])pauVar11[3] = auVar142;
                          *(undefined1 (*) [16])(pauVar11[3] + 0x10) = auVar143;
                        }
                        else {
                          if (iVar36 == 4) {
                            *pauVar12 = auVar47;
                            pauVar12[1] = auVar49;
                            pauVar12[2] = auVar59;
                            pauVar12[3] = auVar48;
                            pauVar12[4] = auVar55;
                            pauVar12[5] = auVar141;
                            pauVar12[6] = auVar142;
                            pauVar12[7] = auVar143;
                            pauVar12 = pauVar12 + 8;
                          }
                          if (iVar36 == 1) {
                            auVar144 = vunpcklps_avx(auVar47,auVar49);
                            auVar146 = vunpcklps_avx(auVar59,auVar48);
                            auVar145 = vunpckhps_avx(auVar47,auVar49);
                            auVar59 = vunpckhps_avx(auVar59,auVar48);
                            auVar47 = vmovlhps_avx(auVar144,auVar146);
                            auVar144 = vunpckhpd_avx(auVar144,auVar146);
                            auVar49 = vmovlhps_avx(auVar145,auVar59);
                            auVar145 = vunpckhpd_avx(auVar145,auVar59);
                            auVar48 = vunpcklps_avx(auVar55,auVar141);
                            auVar146 = vunpcklps_avx(auVar142,auVar143);
                            auVar141 = vunpckhps_avx(auVar55,auVar141);
                            auVar142 = vunpckhps_avx(auVar142,auVar143);
                            auVar59 = vmovlhps_avx(auVar48,auVar146);
                            auVar55 = vunpckhpd_avx(auVar48,auVar146);
                            auVar48 = vmovlhps_avx(auVar141,auVar142);
                            auVar141 = vunpckhpd_avx(auVar141,auVar142);
                            *pauVar12 = auVar47;
                            *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar144;
                            *(undefined1 (*) [16])(*pauVar12 + lVar27 * 4) = auVar49;
                            *(undefined1 (*) [16])(*pauVar12 + lVar35 * 4) = auVar145;
                            pauVar12[1] = auVar59;
                            *(undefined1 (*) [16])(pauVar12[1] + lVar10 * 4) = auVar55;
                            *(undefined1 (*) [16])(pauVar12[1] + lVar27 * 4) = auVar48;
                            *(undefined1 (*) [16])(pauVar12[1] + lVar35 * 4) = auVar141;
                            pauVar12 = pauVar12 + 2;
                          }
                        }
                        pauVar11 = pauVar11 + 4;
                        iVar9 = uVar29 + 0xf;
                        uVar29 = uVar29 + 8;
                      }
                      uVar15 = uVar29 | 3;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar47 = *(undefined1 (*) [16])*pauVar20;
                            auVar46 = ZEXT1664(auVar47);
                            auVar58 = ZEXT1664(auVar47);
                            auVar68 = ZEXT1664(auVar47);
                            auVar76 = ZEXT1664(auVar47);
                          }
                        }
                        else {
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                          auVar58 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                          auVar68 = ZEXT1664(*(undefined1 (*) [16])pauVar11[1]);
                          auVar76 = ZEXT1664(*(undefined1 (*) [16])(pauVar11[1] + 0x10));
                        }
                        auVar48 = auVar76._0_16_;
                        auVar59 = auVar68._0_16_;
                        auVar49 = auVar58._0_16_;
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar31 = 0;
                          iVar9 = iVar38;
                          do {
                            lVar37 = lVar31;
                            auVar48 = *(undefined1 (*) [16])(*pauVar26 + lVar37);
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar37);
                            auVar80._4_4_ = uVar19;
                            auVar80._0_4_ = uVar19;
                            auVar80._8_4_ = uVar19;
                            auVar80._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar48,auVar80);
                            auVar46 = ZEXT1664(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar37 + 4);
                            auVar81._4_4_ = uVar19;
                            auVar81._0_4_ = uVar19;
                            auVar81._8_4_ = uVar19;
                            auVar81._12_4_ = uVar19;
                            auVar49 = vfmadd231ps_fma(auVar58._0_16_,auVar48,auVar81);
                            auVar58 = ZEXT1664(auVar49);
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar37 + 8);
                            auVar82._4_4_ = uVar19;
                            auVar82._0_4_ = uVar19;
                            auVar82._8_4_ = uVar19;
                            auVar82._12_4_ = uVar19;
                            auVar59 = vfmadd231ps_fma(auVar68._0_16_,auVar48,auVar82);
                            auVar68 = ZEXT1664(auVar59);
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar37 + 0xc);
                            auVar83._4_4_ = uVar19;
                            auVar83._0_4_ = uVar19;
                            auVar83._8_4_ = uVar19;
                            auVar83._12_4_ = uVar19;
                            auVar48 = vfmadd231ps_fma(auVar76._0_16_,auVar48,auVar83);
                            auVar76 = ZEXT1664(auVar48);
                            iVar9 = iVar9 + -1;
                            lVar31 = lVar37 + 0x10;
                          } while (iVar9 != 0);
                          pauVar32 = (undefined1 (*) [16])(pauVar32[1] + lVar37);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                          *(undefined1 (*) [16])pauVar11[1] = auVar59;
                          *(undefined1 (*) [16])(pauVar11[1] + 0x10) = auVar48;
                        }
                        else {
                          if (iVar36 == 4) {
                            *pauVar12 = auVar47;
                            pauVar12[1] = auVar49;
                            pauVar12[2] = auVar59;
                            pauVar12[3] = auVar48;
                            pauVar12 = pauVar12 + 4;
                          }
                          if (iVar36 == 1) {
                            auVar141 = vunpcklps_avx(auVar47,auVar49);
                            auVar142 = vunpcklps_avx(auVar59,auVar48);
                            auVar55 = vunpckhps_avx(auVar47,auVar49);
                            auVar48 = vunpckhps_avx(auVar59,auVar48);
                            auVar47 = vmovlhps_avx(auVar141,auVar142);
                            auVar59 = vunpckhpd_avx(auVar141,auVar142);
                            auVar49 = vmovlhps_avx(auVar55,auVar48);
                            auVar48 = vunpckhpd_avx(auVar55,auVar48);
                            *pauVar12 = auVar47;
                            *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar59;
                            *(undefined1 (*) [16])(*pauVar12 + lVar27 * 4) = auVar49;
                            *(undefined1 (*) [16])(*pauVar12 + lVar35 * 4) = auVar48;
                            pauVar12 = pauVar12 + 1;
                          }
                        }
                        pauVar11 = pauVar11 + 2;
                        uVar15 = uVar29 + 7;
                        uVar29 = uVar29 + 4;
                      }
                      uVar15 = uVar29 | 1;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar58 = ZEXT1664(*(undefined1 (*) [16])*pauVar20);
                            auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar20);
                          }
                        }
                        else {
                          auVar58 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                        }
                        auVar49 = auVar46._0_16_;
                        auVar47 = auVar58._0_16_;
                        if (0 < iVar38) {
                          lVar31 = 0;
                          iVar9 = iVar38;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar31);
                            auVar69._4_4_ = uVar19;
                            auVar69._0_4_ = uVar19;
                            auVar69._8_4_ = uVar19;
                            auVar69._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar58._0_16_,
                                                      *(undefined1 (*) [16])(*pauVar26 + lVar31 * 2)
                                                      ,auVar69);
                            auVar58 = ZEXT1664(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar32 + lVar31 + 4);
                            auVar70._4_4_ = uVar19;
                            auVar70._0_4_ = uVar19;
                            auVar70._8_4_ = uVar19;
                            auVar70._12_4_ = uVar19;
                            auVar49 = vfmadd231ps_fma(auVar46._0_16_,
                                                      *(undefined1 (*) [16])(*pauVar26 + lVar31 * 2)
                                                      ,auVar70);
                            auVar46 = ZEXT1664(auVar49);
                            lVar31 = lVar31 + 8;
                            iVar9 = iVar9 + -1;
                          } while (iVar9 != 0);
                          pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar31);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                        }
                        else {
                          if (iVar36 == 4) {
                            *pauVar12 = auVar47;
                            pauVar12[1] = auVar49;
                            pauVar12 = pauVar12 + 2;
                          }
                          if (iVar36 == 1) {
                            *(int *)*pauVar12 = auVar47._0_4_;
                            uVar19 = vextractps_avx(auVar47,1);
                            *(undefined4 *)(*pauVar12 + lVar10 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,2);
                            *(undefined4 *)(*pauVar12 + lVar27 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar47,3);
                            *(undefined4 *)(*pauVar12 + (long)(iVar24 * 3) * 4) = uVar19;
                            *(int *)(*pauVar12 + 4) = auVar49._0_4_;
                            uVar19 = vextractps_avx(auVar49,1);
                            *(undefined4 *)
                             (*pauVar12 + ((long)((local_a0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                 uVar19;
                            uVar19 = vextractps_avx(auVar49,2);
                            *(undefined4 *)(*pauVar12 + local_1d0 * 4) = uVar19;
                            uVar19 = vextractps_avx(auVar49,3);
                            *(undefined4 *)(*pauVar12 + local_1d8 * 4) = uVar19;
                            pauVar12 = (undefined1 (*) [16])(*pauVar12 + 8);
                          }
                        }
                        pauVar11 = pauVar11 + 1;
                        uVar15 = uVar29 + 3;
                        uVar29 = uVar29 + 2;
                      }
                      if ((int)uVar29 < (int)uVar14) {
                        do {
                          if (iVar22 == 0) {
                            if (pauVar20 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar20);
                            }
                          }
                          else {
                            auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                          }
                          auVar47 = auVar46._0_16_;
                          if (0 < iVar38) {
                            lVar31 = 0;
                            iVar9 = iVar38;
                            do {
                              uVar19 = *(undefined4 *)(*pauVar32 + lVar31);
                              auVar50._4_4_ = uVar19;
                              auVar50._0_4_ = uVar19;
                              auVar50._8_4_ = uVar19;
                              auVar50._12_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar50,
                                                        *(undefined1 (*) [16])
                                                         (*pauVar26 + lVar31 * 4));
                              auVar46 = ZEXT1664(auVar47);
                              lVar31 = lVar31 + 4;
                              iVar9 = iVar9 + -1;
                            } while (iVar9 != 0);
                            pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar31);
                          }
                          if (iVar8 < iVar23) {
                            *(undefined1 (*) [16])*pauVar11 = auVar47;
                          }
                          else {
                            if (iVar36 == 4) {
                              *pauVar12 = auVar47;
                              pauVar12 = pauVar12 + 1;
                            }
                            if (iVar36 == 1) {
                              *(int *)*pauVar12 = auVar47._0_4_;
                              uVar19 = vextractps_avx(auVar47,1);
                              *(undefined4 *)(*pauVar12 + lVar10 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar47,2);
                              *(undefined4 *)(*pauVar12 + lVar27 * 4) = uVar19;
                              uVar19 = vextractps_avx(auVar47,3);
                              *(undefined4 *)(*pauVar12 + lVar35 * 4) = uVar19;
                              pauVar12 = (undefined1 (*) [16])(*pauVar12 + 4);
                            }
                          }
                          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar14);
                      }
                      pauVar26 = (undefined1 (*) [32])(*pauVar26 + local_f8);
                      uVar16 = local_1e0 + 4;
                      pauVar18 = pauVar20;
                    } while ((long)(local_1e0 + 7) < local_100);
                  }
                  if ((int)((uint)uVar16 | 1) < (int)local_1c4) {
                    lVar10 = (long)iVar24;
                    lVar35 = (long)local_74;
                    iVar36 = local_74;
                    if (local_58 < lVar35) {
                      iVar36 = TILE_K;
                    }
                    pauVar18 = pauVar20;
                    uVar170 = uVar16 & 0xffffffff;
                    if (local_58 < lVar35) {
                      lVar35 = local_58;
                    }
                    do {
                      pauVar20 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 uVar170 * 4 + local_108 * 4);
                      if (pauVar18 == (undefined1 (*) [32])0x0) {
                        pauVar20 = pauVar18;
                      }
                      uVar29 = 0;
                      pauVar12 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_e0 * 4 + (uVar170 + local_108) * lVar10 * 4);
                      pauVar32 = local_1c0;
                      if (0xb < (int)uVar14) {
                        uVar15 = 0;
                        do {
                          if (iVar22 == 0) {
                            if (pauVar20 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar19 = *(undefined4 *)*pauVar20;
                              auVar41._4_4_ = uVar19;
                              auVar41._0_4_ = uVar19;
                              auVar41._8_4_ = uVar19;
                              auVar41._12_4_ = uVar19;
                              auVar46 = ZEXT1664(auVar41);
                              uVar19 = *(undefined4 *)(*pauVar20 + 4);
                              auVar71._4_4_ = uVar19;
                              auVar71._0_4_ = uVar19;
                              auVar71._8_4_ = uVar19;
                              auVar71._12_4_ = uVar19;
                              auVar76 = ZEXT1664(auVar71);
                              auVar58 = ZEXT1664(auVar41);
                              auVar68 = ZEXT1664(auVar41);
                              auVar79 = ZEXT1664(auVar71);
                              auVar89 = ZEXT1664(auVar71);
                            }
                          }
                          else {
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                  *(undefined1 (*) [16])(*pauVar11 + 0x10),0x88);
                            auVar46 = ZEXT1664(auVar47);
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[1],
                                                  *(undefined1 (*) [16])(pauVar11[1] + 0x10),0x88);
                            auVar58 = ZEXT1664(auVar47);
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[2],
                                                  *(undefined1 (*) [16])(pauVar11[2] + 0x10),0x88);
                            auVar68 = ZEXT1664(auVar47);
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                  *(undefined1 (*) [16])(*pauVar11 + 0x10),0xdd);
                            auVar76 = ZEXT1664(auVar47);
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[1],
                                                  *(undefined1 (*) [16])(pauVar11[1] + 0x10),0xdd);
                            auVar79 = ZEXT1664(auVar47);
                            auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[2],
                                                  *(undefined1 (*) [16])(pauVar11[2] + 0x10),0xdd);
                            auVar89 = ZEXT1664(auVar47);
                          }
                          auVar141 = auVar89._0_16_;
                          auVar59 = auVar68._0_16_;
                          auVar55 = auVar79._0_16_;
                          auVar49 = auVar58._0_16_;
                          auVar48 = auVar76._0_16_;
                          auVar47 = auVar46._0_16_;
                          if (0 < iVar38) {
                            lVar27 = 0;
                            do {
                              uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8);
                              auVar109._4_4_ = uVar19;
                              auVar109._0_4_ = uVar19;
                              auVar109._8_4_ = uVar19;
                              auVar109._12_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar109,*pauVar32);
                              auVar46 = ZEXT1664(auVar47);
                              auVar49 = vfmadd231ps_fma(auVar58._0_16_,auVar109,pauVar32[1]);
                              auVar58 = ZEXT1664(auVar49);
                              auVar59 = vfmadd231ps_fma(auVar68._0_16_,pauVar32[2],auVar109);
                              auVar68 = ZEXT1664(auVar59);
                              uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8 + 4);
                              auVar110._4_4_ = uVar19;
                              auVar110._0_4_ = uVar19;
                              auVar110._8_4_ = uVar19;
                              auVar110._12_4_ = uVar19;
                              auVar48 = vfmadd231ps_fma(auVar76._0_16_,auVar110,*pauVar32);
                              auVar76 = ZEXT1664(auVar48);
                              auVar55 = vfmadd231ps_fma(auVar79._0_16_,auVar110,pauVar32[1]);
                              auVar79 = ZEXT1664(auVar55);
                              auVar141 = vfmadd231ps_fma(auVar89._0_16_,auVar110,pauVar32[2]);
                              auVar89 = ZEXT1664(auVar141);
                              pauVar32 = pauVar32 + 3;
                              lVar27 = lVar27 + 1;
                            } while (iVar36 != (int)lVar27);
                          }
                          if (iVar8 < iVar23) {
                            auVar142 = vunpcklps_avx(auVar47,auVar48);
                            auVar47 = vunpckhps_avx(auVar47,auVar48);
                            auVar48 = vunpcklps_avx(auVar49,auVar55);
                            auVar49 = vunpckhps_avx(auVar49,auVar55);
                            auVar55 = vunpcklps_avx(auVar59,auVar141);
                            auVar59 = vunpckhps_avx(auVar59,auVar141);
                            *(undefined1 (*) [16])*pauVar11 = auVar142;
                            *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar47;
                            *(undefined1 (*) [16])pauVar11[1] = auVar48;
                            *(undefined1 (*) [16])(pauVar11[1] + 0x10) = auVar49;
                            *(undefined1 (*) [16])pauVar11[2] = auVar55;
                            *(undefined1 (*) [16])(pauVar11[2] + 0x10) = auVar59;
                          }
                          else {
                            *pauVar12 = auVar47;
                            pauVar12[1] = auVar49;
                            pauVar12[2] = auVar59;
                            *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar48;
                            *(undefined1 (*) [16])(pauVar12[1] + lVar10 * 4) = auVar55;
                            *(undefined1 (*) [16])(pauVar12[2] + lVar10 * 4) = auVar141;
                            pauVar12 = pauVar12 + 3;
                          }
                          pauVar11 = pauVar11 + 3;
                          uVar29 = uVar15 + 0xc;
                          iVar9 = uVar15 + 0x17;
                          uVar15 = uVar29;
                        } while (iVar9 < (int)uVar14);
                      }
                      iVar9 = uVar29 + 7;
                      while (iVar9 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar19 = *(undefined4 *)*pauVar20;
                            auVar42._4_4_ = uVar19;
                            auVar42._0_4_ = uVar19;
                            auVar42._8_4_ = uVar19;
                            auVar42._12_4_ = uVar19;
                            auVar46 = ZEXT1664(auVar42);
                            uVar19 = *(undefined4 *)(*pauVar20 + 4);
                            auVar60._4_4_ = uVar19;
                            auVar60._0_4_ = uVar19;
                            auVar60._8_4_ = uVar19;
                            auVar60._12_4_ = uVar19;
                            auVar68 = ZEXT1664(auVar60);
                            auVar58 = ZEXT1664(auVar42);
                            auVar76 = ZEXT1664(auVar60);
                          }
                        }
                        else {
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                *(undefined1 (*) [16])(*pauVar11 + 0x10),0x88);
                          auVar46 = ZEXT1664(auVar47);
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[1],
                                                *(undefined1 (*) [16])(pauVar11[1] + 0x10),0x88);
                          auVar58 = ZEXT1664(auVar47);
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                *(undefined1 (*) [16])(*pauVar11 + 0x10),0xdd);
                          auVar68 = ZEXT1664(auVar47);
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])pauVar11[1],
                                                *(undefined1 (*) [16])(pauVar11[1] + 0x10),0xdd);
                          auVar76 = ZEXT1664(auVar47);
                        }
                        auVar48 = auVar76._0_16_;
                        auVar49 = auVar58._0_16_;
                        auVar59 = auVar68._0_16_;
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar27 = 0;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8);
                            auVar90._4_4_ = uVar19;
                            auVar90._0_4_ = uVar19;
                            auVar90._8_4_ = uVar19;
                            auVar90._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar90,*pauVar32);
                            auVar46 = ZEXT1664(auVar47);
                            auVar49 = vfmadd231ps_fma(auVar58._0_16_,pauVar32[1],auVar90);
                            auVar58 = ZEXT1664(auVar49);
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8 + 4);
                            auVar91._4_4_ = uVar19;
                            auVar91._0_4_ = uVar19;
                            auVar91._8_4_ = uVar19;
                            auVar91._12_4_ = uVar19;
                            auVar59 = vfmadd231ps_fma(auVar68._0_16_,auVar91,*pauVar32);
                            auVar68 = ZEXT1664(auVar59);
                            auVar48 = vfmadd231ps_fma(auVar76._0_16_,auVar91,pauVar32[1]);
                            auVar76 = ZEXT1664(auVar48);
                            pauVar32 = pauVar32 + 2;
                            lVar27 = lVar27 + 1;
                          } while ((int)lVar35 != (int)lVar27);
                        }
                        if (iVar8 < iVar23) {
                          auVar55 = vunpcklps_avx(auVar47,auVar59);
                          auVar47 = vunpckhps_avx(auVar47,auVar59);
                          auVar59 = vunpcklps_avx(auVar49,auVar48);
                          auVar49 = vunpckhps_avx(auVar49,auVar48);
                          *(undefined1 (*) [16])*pauVar11 = auVar55;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar47;
                          *(undefined1 (*) [16])pauVar11[1] = auVar59;
                          *(undefined1 (*) [16])(pauVar11[1] + 0x10) = auVar49;
                        }
                        else {
                          *pauVar12 = auVar47;
                          pauVar12[1] = auVar49;
                          *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar59;
                          *(undefined1 (*) [16])(pauVar12[1] + lVar10 * 4) = auVar48;
                          pauVar12 = pauVar12 + 2;
                        }
                        pauVar11 = pauVar11 + 2;
                        iVar9 = uVar29 + 0xf;
                        uVar29 = uVar29 + 8;
                      }
                      uVar15 = uVar29 | 3;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar19 = *(undefined4 *)*pauVar20;
                            auVar46 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,
                                                  uVar19))));
                            uVar19 = *(undefined4 *)(*pauVar20 + 4);
                            auVar58 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,
                                                  uVar19))));
                          }
                        }
                        else {
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                *(undefined1 (*) [16])(*pauVar11 + 0x10),0x88);
                          auVar46 = ZEXT1664(auVar47);
                          auVar47 = vshufps_avx(*(undefined1 (*) [16])*pauVar11,
                                                *(undefined1 (*) [16])(*pauVar11 + 0x10),0xdd);
                          auVar58 = ZEXT1664(auVar47);
                        }
                        auVar49 = auVar58._0_16_;
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar27 = 0;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8);
                            auVar72._4_4_ = uVar19;
                            auVar72._0_4_ = uVar19;
                            auVar72._8_4_ = uVar19;
                            auVar72._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,*pauVar32,auVar72);
                            auVar46 = ZEXT1664(auVar47);
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 8 + 4);
                            auVar73._4_4_ = uVar19;
                            auVar73._0_4_ = uVar19;
                            auVar73._8_4_ = uVar19;
                            auVar73._12_4_ = uVar19;
                            auVar49 = vfmadd231ps_fma(auVar58._0_16_,*pauVar32,auVar73);
                            auVar58 = ZEXT1664(auVar49);
                            pauVar32 = pauVar32 + 1;
                            lVar27 = lVar27 + 1;
                          } while ((int)lVar35 != (int)lVar27);
                        }
                        if (iVar8 < iVar23) {
                          auVar59 = vunpcklps_avx(auVar47,auVar49);
                          auVar47 = vunpckhps_avx(auVar47,auVar49);
                          *(undefined1 (*) [16])*pauVar11 = auVar59;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar47;
                        }
                        else {
                          *pauVar12 = auVar47;
                          *(undefined1 (*) [16])(*pauVar12 + lVar10 * 4) = auVar49;
                          pauVar12 = pauVar12 + 1;
                        }
                        pauVar11 = pauVar11 + 1;
                        uVar15 = uVar29 + 7;
                        uVar29 = uVar29 + 4;
                      }
                      uVar15 = uVar29 | 1;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar20 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar46 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar20,
                                                        *(undefined8 *)*pauVar20));
                          }
                        }
                        else {
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                        }
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar27 = 0;
                          lVar31 = 0;
                          do {
                            auVar51._8_8_ = *(undefined8 *)(*pauVar26 + lVar31 * 8);
                            auVar51._0_8_ = *(undefined8 *)(*pauVar26 + lVar31 * 8);
                            auVar61._8_8_ = 0;
                            auVar61._0_8_ = *(ulong *)(*pauVar32 + lVar31 * 8);
                            auVar47 = vshufps_avx(auVar61,auVar61,0x50);
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar51,auVar47);
                            auVar46 = ZEXT1664(auVar47);
                            lVar31 = lVar31 + 1;
                            lVar27 = lVar27 + -8;
                          } while (iVar36 != (int)lVar31);
                          pauVar32 = (undefined1 (*) [16])((long)pauVar32 - lVar27);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                        }
                        else {
                          auVar49 = vshufps_avx(auVar47,auVar47,0xe8);
                          uVar1 = vmovlps_avx(auVar49);
                          *(undefined8 *)*pauVar12 = uVar1;
                          uVar19 = vextractps_avx(auVar47,1);
                          *(undefined4 *)(*pauVar12 + lVar10 * 4) = uVar19;
                          uVar19 = vextractps_avx(auVar47,3);
                          *(undefined4 *)
                           (*pauVar12 + ((long)((local_a0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                               uVar19;
                          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 8);
                        }
                        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                        uVar15 = uVar29 + 3;
                        uVar29 = uVar29 + 2;
                      }
                      if ((int)uVar29 < (int)uVar14) {
                        do {
                          pauVar18 = pauVar11;
                          if ((iVar22 != 0) ||
                             (auVar43 = ZEXT816(0) << 0x40, pauVar18 = pauVar20,
                             pauVar20 != (undefined1 (*) [32])0x0)) {
                            auVar43._8_8_ = 0;
                            auVar43._0_8_ = *(ulong *)*pauVar18;
                          }
                          if (0 < iVar38) {
                            lVar27 = 0;
                            do {
                              auVar52._8_8_ = 0;
                              auVar52._0_8_ = *(ulong *)(*pauVar26 + lVar27 * 8);
                              uVar19 = *(undefined4 *)*pauVar32;
                              auVar62._4_4_ = uVar19;
                              auVar62._0_4_ = uVar19;
                              auVar62._8_4_ = uVar19;
                              auVar62._12_4_ = uVar19;
                              auVar43 = vfmadd231ps_fma(auVar43,auVar52,auVar62);
                              pauVar32 = (undefined1 (*) [16])(*pauVar32 + 4);
                              lVar27 = lVar27 + 1;
                            } while (iVar36 != (int)lVar27);
                          }
                          if (iVar8 < iVar23) {
                            uVar1 = vmovlps_avx(auVar43);
                            *(undefined8 *)*pauVar11 = uVar1;
                          }
                          else {
                            *(int *)*pauVar12 = auVar43._0_4_;
                            uVar19 = vextractps_avx(auVar43,1);
                            *(undefined4 *)(*pauVar12 + lVar10 * 4) = uVar19;
                            pauVar12 = (undefined1 (*) [16])(*pauVar12 + 4);
                          }
                          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar14);
                      }
                      pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)(iVar38 * 2) * 4);
                      uVar16 = uVar170 + 2;
                      lVar27 = uVar170 + 3;
                      pauVar18 = pauVar20;
                      uVar170 = uVar16;
                    } while (lVar27 < local_100);
                  }
                  if ((int)uVar16 < (int)local_1c4) {
                    lVar35 = (long)(int)uVar16;
                    do {
                      pauVar18 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 lVar35 * 4 + local_108 * 4);
                      if (pauVar20 == (undefined1 (*) [32])0x0) {
                        pauVar18 = pauVar20;
                      }
                      uVar29 = 0;
                      pauVar12 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_e0 * 4 + (lVar35 + local_108) * (long)iVar24 * 4);
                      pauVar32 = local_1c0;
                      if (0xb < (int)uVar14) {
                        uVar15 = 0;
                        do {
                          if (iVar22 == 0) {
                            if (pauVar18 == (undefined1 (*) [32])0x0) {
                              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar19 = *(undefined4 *)*pauVar18;
                              auVar44._4_4_ = uVar19;
                              auVar44._0_4_ = uVar19;
                              auVar44._8_4_ = uVar19;
                              auVar44._12_4_ = uVar19;
                              auVar46 = ZEXT1664(auVar44);
                              auVar58 = ZEXT1664(auVar44);
                              auVar68 = ZEXT1664(auVar44);
                            }
                          }
                          else {
                            auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                            auVar58 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                            auVar68 = ZEXT1664(*(undefined1 (*) [16])pauVar11[1]);
                          }
                          auVar59 = auVar68._0_16_;
                          auVar49 = auVar58._0_16_;
                          auVar47 = auVar46._0_16_;
                          if (0 < iVar38) {
                            lVar10 = 0;
                            do {
                              uVar19 = *(undefined4 *)(*pauVar26 + lVar10 * 4);
                              auVar74._4_4_ = uVar19;
                              auVar74._0_4_ = uVar19;
                              auVar74._8_4_ = uVar19;
                              auVar74._12_4_ = uVar19;
                              auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar74,*pauVar32);
                              auVar46 = ZEXT1664(auVar47);
                              auVar49 = vfmadd231ps_fma(auVar58._0_16_,auVar74,pauVar32[1]);
                              auVar58 = ZEXT1664(auVar49);
                              auVar59 = vfmadd231ps_fma(auVar68._0_16_,auVar74,pauVar32[2]);
                              auVar68 = ZEXT1664(auVar59);
                              pauVar32 = pauVar32 + 3;
                              lVar10 = lVar10 + 1;
                            } while (iVar38 != (int)lVar10);
                          }
                          if (iVar8 < iVar23) {
                            *(undefined1 (*) [16])*pauVar11 = auVar47;
                            *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                            *(undefined1 (*) [16])pauVar11[1] = auVar59;
                          }
                          else {
                            *pauVar12 = auVar47;
                            pauVar12[1] = auVar49;
                            pauVar12[2] = auVar59;
                            pauVar12 = pauVar12 + 3;
                          }
                          pauVar11 = (undefined1 (*) [32])(pauVar11[1] + 0x10);
                          uVar29 = uVar15 + 0xc;
                          iVar36 = uVar15 + 0x17;
                          uVar15 = uVar29;
                        } while (iVar36 < (int)uVar14);
                      }
                      iVar36 = uVar29 + 7;
                      while (iVar36 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar18 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar19 = *(undefined4 *)*pauVar18;
                            auVar45._4_4_ = uVar19;
                            auVar45._0_4_ = uVar19;
                            auVar45._8_4_ = uVar19;
                            auVar45._12_4_ = uVar19;
                            auVar46 = ZEXT1664(auVar45);
                            auVar58 = ZEXT1664(auVar45);
                          }
                        }
                        else {
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                          auVar58 = ZEXT1664(*(undefined1 (*) [16])(*pauVar11 + 0x10));
                        }
                        auVar49 = auVar58._0_16_;
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar10 = 0;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar10 * 4);
                            auVar63._4_4_ = uVar19;
                            auVar63._0_4_ = uVar19;
                            auVar63._8_4_ = uVar19;
                            auVar63._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar63,*pauVar32);
                            auVar46 = ZEXT1664(auVar47);
                            auVar49 = vfmadd231ps_fma(auVar58._0_16_,auVar63,pauVar32[1]);
                            auVar58 = ZEXT1664(auVar49);
                            pauVar32 = pauVar32 + 2;
                            lVar10 = lVar10 + 1;
                          } while (iVar38 != (int)lVar10);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                          *(undefined1 (*) [16])(*pauVar11 + 0x10) = auVar49;
                        }
                        else {
                          *pauVar12 = auVar47;
                          pauVar12[1] = auVar49;
                          pauVar12 = pauVar12 + 2;
                        }
                        pauVar11 = pauVar11 + 1;
                        iVar36 = uVar29 + 0xf;
                        uVar29 = uVar29 + 8;
                      }
                      uVar15 = uVar29 | 3;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar18 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar19 = *(undefined4 *)*pauVar18;
                            auVar46 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,
                                                  uVar19))));
                          }
                        }
                        else {
                          auVar46 = ZEXT1664(*(undefined1 (*) [16])*pauVar11);
                        }
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar10 = 0;
                          do {
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar10 * 4);
                            auVar53._4_4_ = uVar19;
                            auVar53._0_4_ = uVar19;
                            auVar53._8_4_ = uVar19;
                            auVar53._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar53,*pauVar32);
                            auVar46 = ZEXT1664(auVar47);
                            pauVar32 = pauVar32 + 1;
                            lVar10 = lVar10 + 1;
                          } while (iVar38 != (int)lVar10);
                        }
                        if (iVar8 < iVar23) {
                          *(undefined1 (*) [16])*pauVar11 = auVar47;
                        }
                        else {
                          *pauVar12 = auVar47;
                          pauVar12 = pauVar12 + 1;
                        }
                        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
                        uVar15 = uVar29 + 7;
                        uVar29 = uVar29 + 4;
                      }
                      uVar15 = uVar29 | 1;
                      while ((int)uVar15 < (int)uVar14) {
                        if (iVar22 == 0) {
                          if (pauVar18 == (undefined1 (*) [32])0x0) {
                            auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar19 = *(undefined4 *)*pauVar18;
                            auVar46 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,
                                                  uVar19))));
                          }
                        }
                        else {
                          auVar46 = ZEXT864(*(ulong *)*pauVar11);
                        }
                        auVar47 = auVar46._0_16_;
                        if (0 < iVar38) {
                          lVar10 = 0;
                          lVar27 = 0;
                          do {
                            auVar54._8_8_ = 0;
                            auVar54._0_8_ = *(ulong *)(*pauVar32 + lVar27 * 8);
                            uVar19 = *(undefined4 *)(*pauVar26 + lVar27 * 4);
                            auVar64._4_4_ = uVar19;
                            auVar64._0_4_ = uVar19;
                            auVar64._8_4_ = uVar19;
                            auVar64._12_4_ = uVar19;
                            auVar47 = vfmadd231ps_fma(auVar46._0_16_,auVar54,auVar64);
                            auVar46 = ZEXT1664(auVar47);
                            lVar27 = lVar27 + 1;
                            lVar10 = lVar10 + -8;
                          } while (iVar38 != (int)lVar27);
                          pauVar32 = (undefined1 (*) [16])((long)pauVar32 - lVar10);
                        }
                        if (iVar8 < iVar23) {
                          uVar1 = vmovlps_avx(auVar47);
                          *(undefined8 *)*pauVar11 = uVar1;
                        }
                        else {
                          uVar1 = vmovlps_avx(auVar47);
                          *(undefined8 *)*pauVar12 = uVar1;
                          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 8);
                        }
                        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 8);
                        uVar15 = uVar29 + 3;
                        uVar29 = uVar29 + 2;
                      }
                      if ((int)uVar29 < (int)uVar14) {
                        do {
                          auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                          if (pauVar18 != (undefined1 (*) [32])0x0 || iVar22 != 0) {
                            pauVar20 = pauVar18;
                            if (iVar22 != 0) {
                              pauVar20 = pauVar11;
                            }
                            auVar46 = ZEXT464(*(uint *)*pauVar20);
                          }
                          if (0 < iVar38) {
                            lVar10 = 0;
                            do {
                              auVar47 = vfmadd231ss_fma(auVar46._0_16_,ZEXT416(*(uint *)*pauVar32),
                                                        ZEXT416(*(uint *)(*pauVar26 + lVar10 * 4)));
                              auVar46 = ZEXT1664(auVar47);
                              pauVar32 = (undefined1 (*) [16])(*pauVar32 + 4);
                              lVar10 = lVar10 + 1;
                            } while (iVar38 != (int)lVar10);
                          }
                          if (iVar8 < iVar23) {
                            *(int *)*pauVar11 = auVar46._0_4_;
                          }
                          else {
                            *(int *)*pauVar12 = auVar46._0_4_;
                            pauVar12 = (undefined1 (*) [16])(*pauVar12 + 4);
                          }
                          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar14);
                      }
                      lVar35 = lVar35 + 1;
                      pauVar26 = (undefined1 (*) [32])(*pauVar26 + (long)iVar38 * 4);
                      pauVar20 = pauVar18;
                    } while (lVar35 != local_100);
                  }
                  iVar22 = iVar22 + TILE_K;
                  local_10c = uVar14;
                  local_e4 = iVar7;
                } while (iVar22 < iVar23);
              }
              iVar7 = iVar7 + TILE_N;
              uVar16 = local_70;
            } while (iVar7 < (int)local_70);
          }
          uVar14 = (int)uVar13 + 1;
          uVar170 = (ulong)uVar14;
          local_60 = uVar13;
        } while (uVar14 != local_ec);
      }
      iVar9 = 0;
    }
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
  }
  piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  if (iVar9 == 0) {
    pLVar28 = this->activation;
    iVar9 = 0;
    if (pLVar28 != (Layer *)0x0) {
      (*pLVar28->_vptr_Layer[9])(pLVar28,top_blob,opt);
      iVar9 = 0;
    }
  }
LAB_001d7e74:
  piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar2 == (int *)0x0) {
    return iVar9;
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 != 0) {
    return iVar9;
  }
  if (local_228.allocator != (Allocator *)0x0) {
    (*(local_228.allocator)->_vptr_Allocator[3])();
    return iVar9;
  }
  if (local_228.data == (void *)0x0) {
    return iVar9;
  }
  free(local_228.data);
  return iVar9;
}

Assistant:

int Convolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}